

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  ulong uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  byte bVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar85;
  long lVar86;
  long lVar87;
  ulong uVar88;
  uint uVar89;
  uint uVar90;
  byte bVar91;
  bool bVar92;
  vint4 bi_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar99 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar142;
  float fVar145;
  vint4 ai;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar148;
  undefined1 auVar122 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar149;
  float fVar153;
  float fVar155;
  float fVar157;
  undefined1 auVar130 [32];
  float fVar143;
  float fVar150;
  undefined1 auVar131 [32];
  float fVar119;
  float fVar146;
  float fVar151;
  float fVar156;
  undefined1 auVar132 [32];
  float fVar144;
  float fVar147;
  float fVar152;
  float fVar154;
  float fVar158;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar159;
  float fVar160;
  float fVar175;
  float fVar176;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar177;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar164 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  vint4 bi_1;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [28];
  undefined1 auVar216 [32];
  float fVar224;
  undefined1 auVar217 [32];
  float fVar225;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar241;
  float fVar242;
  vint4 bi;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [28];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar255;
  float fVar258;
  vint4 ai_1;
  undefined1 auVar250 [16];
  float fVar261;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar256;
  float fVar259;
  float fVar262;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar253 [28];
  float fVar257;
  float fVar260;
  float fVar263;
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar254 [32];
  float fVar270;
  float fVar278;
  float fVar279;
  vint4 ai_2;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar280;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [28];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [64];
  float s;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar296;
  float fVar299;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [28];
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar295 [32];
  float fVar316;
  float fVar317;
  float fVar325;
  float fVar327;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar326;
  float fVar328;
  float fVar330;
  float fVar334;
  float fVar335;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar329;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar324 [64];
  float fVar336;
  float fVar343;
  float fVar344;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar345;
  undefined1 auVar340 [16];
  float fVar349;
  undefined1 auVar341 [32];
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar342 [64];
  float fVar350;
  float fVar351;
  float fVar356;
  float fVar358;
  undefined1 auVar352 [16];
  float fVar360;
  undefined1 auVar353 [32];
  float fVar357;
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar365;
  float fVar367;
  undefined1 auVar354 [32];
  float fVar362;
  float fVar364;
  float fVar366;
  undefined1 auVar355 [64];
  float fVar368;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar372 [64];
  float fVar379;
  float fVar380;
  float fVar383;
  float fVar385;
  float fVar387;
  undefined1 auVar381 [16];
  float fVar384;
  float fVar386;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  undefined1 auVar382 [32];
  undefined1 auVar398 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b24;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined4 local_8d8;
  float local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  uint local_8c8;
  uint local_8c4;
  uint local_8c0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar11 = prim[1];
  uVar83 = (ulong)(byte)PVar11;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  lVar86 = uVar83 * 0x25;
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar182 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  fVar316 = *(float *)(prim + lVar86 + 0x12);
  auVar101 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar86 + 6));
  auVar93._0_4_ = fVar316 * (ray->dir).field_0.m128[0];
  auVar93._4_4_ = fVar316 * (ray->dir).field_0.m128[1];
  auVar93._8_4_ = fVar316 * (ray->dir).field_0.m128[2];
  auVar93._12_4_ = fVar316 * (ray->dir).field_0.m128[3];
  auVar202._0_4_ = fVar316 * auVar101._0_4_;
  auVar202._4_4_ = fVar316 * auVar101._4_4_;
  auVar202._8_4_ = fVar316 * auVar101._8_4_;
  auVar202._12_4_ = fVar316 * auVar101._12_4_;
  auVar101 = vcvtdq2ps_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar185);
  auVar123 = vcvtdq2ps_avx(auVar206);
  auVar124 = vcvtdq2ps_avx(auVar182);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar17 = vshufps_avx(auVar93,auVar93,0);
  auVar185 = vshufps_avx(auVar93,auVar93,0x55);
  auVar206 = vshufps_avx(auVar93,auVar93,0xaa);
  fVar316 = auVar206._0_4_;
  fVar325 = auVar206._4_4_;
  fVar327 = auVar206._8_4_;
  fVar329 = auVar206._12_4_;
  fVar143 = auVar185._0_4_;
  fVar150 = auVar185._4_4_;
  fVar155 = auVar185._8_4_;
  fVar160 = auVar185._12_4_;
  fVar270 = auVar17._0_4_;
  fVar278 = auVar17._4_4_;
  fVar279 = auVar17._8_4_;
  fVar280 = auVar17._12_4_;
  auVar271._0_4_ = fVar270 * auVar101._0_4_ + auVar16._0_4_ * fVar143 + auVar123._0_4_ * fVar316;
  auVar271._4_4_ = fVar278 * auVar101._4_4_ + auVar16._4_4_ * fVar150 + auVar123._4_4_ * fVar325;
  auVar271._8_4_ = fVar279 * auVar101._8_4_ + auVar16._8_4_ * fVar155 + auVar123._8_4_ * fVar327;
  auVar271._12_4_ = fVar280 * auVar101._12_4_ + auVar16._12_4_ * fVar160 + auVar123._12_4_ * fVar329
  ;
  auVar250._0_4_ = auVar18._0_4_ * fVar143 + auVar19._0_4_ * fVar316 + fVar270 * auVar124._0_4_;
  auVar250._4_4_ = auVar18._4_4_ * fVar150 + auVar19._4_4_ * fVar325 + fVar278 * auVar124._4_4_;
  auVar250._8_4_ = auVar18._8_4_ * fVar155 + auVar19._8_4_ * fVar327 + fVar279 * auVar124._8_4_;
  auVar250._12_4_ = auVar18._12_4_ * fVar160 + auVar19._12_4_ * fVar329 + fVar280 * auVar124._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar95);
  auVar318._0_4_ = fVar270 * auVar17._0_4_ + fVar143 * auVar127._0_4_ + auVar20._0_4_ * fVar316;
  auVar318._4_4_ = fVar278 * auVar17._4_4_ + fVar150 * auVar127._4_4_ + auVar20._4_4_ * fVar325;
  auVar318._8_4_ = fVar279 * auVar17._8_4_ + fVar155 * auVar127._8_4_ + auVar20._8_4_ * fVar327;
  auVar318._12_4_ = fVar280 * auVar17._12_4_ + fVar160 * auVar127._12_4_ + auVar20._12_4_ * fVar329;
  auVar185 = vshufps_avx(auVar202,auVar202,0xaa);
  fVar316 = auVar185._0_4_;
  fVar325 = auVar185._4_4_;
  fVar327 = auVar185._8_4_;
  fVar329 = auVar185._12_4_;
  auVar185 = vshufps_avx(auVar202,auVar202,0x55);
  fVar143 = auVar185._0_4_;
  fVar150 = auVar185._4_4_;
  fVar155 = auVar185._8_4_;
  fVar160 = auVar185._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar95 = vpmovsxwd_avx(auVar185);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar206);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar182 = vpmovsxwd_avx(auVar182);
  auVar185 = vshufps_avx(auVar202,auVar202,0);
  fVar270 = auVar185._0_4_;
  fVar278 = auVar185._4_4_;
  fVar279 = auVar185._8_4_;
  fVar280 = auVar185._12_4_;
  auVar226._0_4_ = auVar16._0_4_ * fVar143 + auVar123._0_4_ * fVar316 + fVar270 * auVar101._0_4_;
  auVar226._4_4_ = auVar16._4_4_ * fVar150 + auVar123._4_4_ * fVar325 + fVar278 * auVar101._4_4_;
  auVar226._8_4_ = auVar16._8_4_ * fVar155 + auVar123._8_4_ * fVar327 + fVar279 * auVar101._8_4_;
  auVar226._12_4_ = auVar16._12_4_ * fVar160 + auVar123._12_4_ * fVar329 + fVar280 * auVar101._12_4_
  ;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar203._0_4_ = auVar18._0_4_ * fVar143 + auVar19._0_4_ * fVar316 + fVar270 * auVar124._0_4_;
  auVar203._4_4_ = auVar18._4_4_ * fVar150 + auVar19._4_4_ * fVar325 + fVar278 * auVar124._4_4_;
  auVar203._8_4_ = auVar18._8_4_ * fVar155 + auVar19._8_4_ * fVar327 + fVar279 * auVar124._8_4_;
  auVar203._12_4_ = auVar18._12_4_ * fVar160 + auVar19._12_4_ * fVar329 + fVar280 * auVar124._12_4_;
  auVar178._0_4_ = fVar270 * auVar17._0_4_ + fVar143 * auVar127._0_4_ + auVar20._0_4_ * fVar316;
  auVar178._4_4_ = fVar278 * auVar17._4_4_ + fVar150 * auVar127._4_4_ + auVar20._4_4_ * fVar325;
  auVar178._8_4_ = fVar279 * auVar17._8_4_ + fVar155 * auVar127._8_4_ + auVar20._8_4_ * fVar327;
  auVar178._12_4_ = fVar280 * auVar17._12_4_ + fVar160 * auVar127._12_4_ + auVar20._12_4_ * fVar329;
  auVar381._8_4_ = 0x7fffffff;
  auVar381._0_8_ = 0x7fffffff7fffffff;
  auVar381._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar381,auVar271);
  auVar337._8_4_ = 0x219392ef;
  auVar337._0_8_ = 0x219392ef219392ef;
  auVar337._12_4_ = 0x219392ef;
  auVar17 = vcmpps_avx(auVar17,auVar337,1);
  auVar185 = vblendvps_avx(auVar271,auVar337,auVar17);
  auVar17 = vandps_avx(auVar381,auVar250);
  auVar17 = vcmpps_avx(auVar17,auVar337,1);
  auVar206 = vblendvps_avx(auVar250,auVar337,auVar17);
  auVar17 = vandps_avx(auVar318,auVar381);
  auVar17 = vcmpps_avx(auVar17,auVar337,1);
  auVar17 = vblendvps_avx(auVar318,auVar337,auVar17);
  auVar16 = vrcpps_avx(auVar185);
  fVar247 = auVar16._0_4_;
  auVar94._0_4_ = fVar247 * auVar185._0_4_;
  fVar255 = auVar16._4_4_;
  auVar94._4_4_ = fVar255 * auVar185._4_4_;
  fVar258 = auVar16._8_4_;
  auVar94._8_4_ = fVar258 * auVar185._8_4_;
  fVar261 = auVar16._12_4_;
  auVar94._12_4_ = fVar261 * auVar185._12_4_;
  auVar338._8_4_ = 0x3f800000;
  auVar338._0_8_ = 0x3f8000003f800000;
  auVar338._12_4_ = 0x3f800000;
  auVar185 = vsubps_avx(auVar338,auVar94);
  fVar247 = fVar247 + fVar247 * auVar185._0_4_;
  fVar255 = fVar255 + fVar255 * auVar185._4_4_;
  fVar258 = fVar258 + fVar258 * auVar185._8_4_;
  fVar261 = fVar261 + fVar261 * auVar185._12_4_;
  auVar185 = vrcpps_avx(auVar206);
  fVar270 = auVar185._0_4_;
  auVar272._0_4_ = fVar270 * auVar206._0_4_;
  fVar278 = auVar185._4_4_;
  auVar272._4_4_ = fVar278 * auVar206._4_4_;
  fVar279 = auVar185._8_4_;
  auVar272._8_4_ = fVar279 * auVar206._8_4_;
  fVar280 = auVar185._12_4_;
  auVar272._12_4_ = fVar280 * auVar206._12_4_;
  auVar185 = vsubps_avx(auVar338,auVar272);
  fVar270 = fVar270 + fVar270 * auVar185._0_4_;
  fVar278 = fVar278 + fVar278 * auVar185._4_4_;
  fVar279 = fVar279 + fVar279 * auVar185._8_4_;
  fVar280 = fVar280 + fVar280 * auVar185._12_4_;
  auVar185 = vrcpps_avx(auVar17);
  fVar316 = auVar185._0_4_;
  auVar319._0_4_ = auVar17._0_4_ * fVar316;
  fVar325 = auVar185._4_4_;
  auVar319._4_4_ = auVar17._4_4_ * fVar325;
  fVar327 = auVar185._8_4_;
  auVar319._8_4_ = auVar17._8_4_ * fVar327;
  fVar329 = auVar185._12_4_;
  auVar319._12_4_ = auVar17._12_4_ * fVar329;
  auVar17 = vsubps_avx(auVar338,auVar319);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 6);
  auVar206 = vpmovsxwd_avx(auVar16);
  fVar316 = auVar17._0_4_ * fVar316 + fVar316;
  fVar325 = auVar17._4_4_ * fVar325 + fVar325;
  fVar327 = auVar17._8_4_ * fVar327 + fVar327;
  fVar329 = auVar17._12_4_ * fVar329 + fVar329;
  auVar16 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                         *(float *)(prim + lVar86 + 0x16)) *
                                        *(float *)(prim + lVar86 + 0x1a))),0);
  auVar17 = vcvtdq2ps_avx(auVar93);
  auVar185 = vcvtdq2ps_avx(auVar95);
  auVar185 = vsubps_avx(auVar185,auVar17);
  fVar143 = auVar16._0_4_;
  fVar150 = auVar16._4_4_;
  fVar155 = auVar16._8_4_;
  fVar160 = auVar16._12_4_;
  auVar120._0_4_ = auVar185._0_4_ * fVar143 + auVar17._0_4_;
  auVar120._4_4_ = auVar185._4_4_ * fVar150 + auVar17._4_4_;
  auVar120._8_4_ = auVar185._8_4_ * fVar155 + auVar17._8_4_;
  auVar120._12_4_ = auVar185._12_4_ * fVar160 + auVar17._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar96);
  auVar185 = vcvtdq2ps_avx(auVar182);
  auVar185 = vsubps_avx(auVar185,auVar17);
  auVar281._0_4_ = auVar185._0_4_ * fVar143 + auVar17._0_4_;
  auVar281._4_4_ = auVar185._4_4_ * fVar150 + auVar17._4_4_;
  auVar281._8_4_ = auVar185._8_4_ * fVar155 + auVar17._8_4_;
  auVar281._12_4_ = auVar185._12_4_ * fVar160 + auVar17._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar101);
  auVar185 = vcvtdq2ps_avx(auVar206);
  auVar185 = vsubps_avx(auVar185,auVar17);
  auVar292._0_4_ = auVar185._0_4_ * fVar143 + auVar17._0_4_;
  auVar292._4_4_ = auVar185._4_4_ * fVar150 + auVar17._4_4_;
  auVar292._8_4_ = auVar185._8_4_ * fVar155 + auVar17._8_4_;
  auVar292._12_4_ = auVar185._12_4_ * fVar160 + auVar17._12_4_;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar17 = vpmovsxwd_avx(auVar123);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar185 = vpmovsxwd_avx(auVar124);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar206 = vsubps_avx(auVar185,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar185 = vpmovsxwd_avx(auVar18);
  auVar339._0_4_ = auVar206._0_4_ * fVar143 + auVar17._0_4_;
  auVar339._4_4_ = auVar206._4_4_ * fVar150 + auVar17._4_4_;
  auVar339._8_4_ = auVar206._8_4_ * fVar155 + auVar17._8_4_;
  auVar339._12_4_ = auVar206._12_4_ * fVar160 + auVar17._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar185);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 6);
  auVar185 = vpmovsxwd_avx(auVar19);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar185 = vsubps_avx(auVar185,auVar17);
  auVar352._0_4_ = auVar185._0_4_ * fVar143 + auVar17._0_4_;
  auVar352._4_4_ = auVar185._4_4_ * fVar150 + auVar17._4_4_;
  auVar352._8_4_ = auVar185._8_4_ * fVar155 + auVar17._8_4_;
  auVar352._12_4_ = auVar185._12_4_ * fVar160 + auVar17._12_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 6);
  auVar17 = vpmovsxwd_avx(auVar127);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar185 = vpmovsxwd_avx(auVar20);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar185 = vsubps_avx(auVar185,auVar17);
  auVar95._0_4_ = auVar17._0_4_ + auVar185._0_4_ * fVar143;
  auVar95._4_4_ = auVar17._4_4_ + auVar185._4_4_ * fVar150;
  auVar95._8_4_ = auVar17._8_4_ + auVar185._8_4_ * fVar155;
  auVar95._12_4_ = auVar17._12_4_ + auVar185._12_4_ * fVar160;
  auVar17 = vsubps_avx(auVar120,auVar226);
  auVar121._0_4_ = fVar247 * auVar17._0_4_;
  auVar121._4_4_ = fVar255 * auVar17._4_4_;
  auVar121._8_4_ = fVar258 * auVar17._8_4_;
  auVar121._12_4_ = fVar261 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar281,auVar226);
  auVar227._0_4_ = fVar247 * auVar17._0_4_;
  auVar227._4_4_ = fVar255 * auVar17._4_4_;
  auVar227._8_4_ = fVar258 * auVar17._8_4_;
  auVar227._12_4_ = fVar261 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar292,auVar203);
  auVar251._0_4_ = fVar270 * auVar17._0_4_;
  auVar251._4_4_ = fVar278 * auVar17._4_4_;
  auVar251._8_4_ = fVar279 * auVar17._8_4_;
  auVar251._12_4_ = fVar280 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar339,auVar203);
  auVar204._0_4_ = fVar270 * auVar17._0_4_;
  auVar204._4_4_ = fVar278 * auVar17._4_4_;
  auVar204._8_4_ = fVar279 * auVar17._8_4_;
  auVar204._12_4_ = fVar280 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar352,auVar178);
  auVar273._0_4_ = fVar316 * auVar17._0_4_;
  auVar273._4_4_ = fVar325 * auVar17._4_4_;
  auVar273._8_4_ = fVar327 * auVar17._8_4_;
  auVar273._12_4_ = fVar329 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar95,auVar178);
  auVar96._0_4_ = fVar316 * auVar17._0_4_;
  auVar96._4_4_ = fVar325 * auVar17._4_4_;
  auVar96._8_4_ = fVar327 * auVar17._8_4_;
  auVar96._12_4_ = fVar329 * auVar17._12_4_;
  auVar17 = vpminsd_avx(auVar121,auVar227);
  auVar185 = vpminsd_avx(auVar251,auVar204);
  auVar17 = vmaxps_avx(auVar17,auVar185);
  auVar185 = vpminsd_avx(auVar273,auVar96);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar293._4_4_ = uVar7;
  auVar293._0_4_ = uVar7;
  auVar293._8_4_ = uVar7;
  auVar293._12_4_ = uVar7;
  auVar185 = vmaxps_avx(auVar185,auVar293);
  auVar17 = vmaxps_avx(auVar17,auVar185);
  local_5a0._0_4_ = auVar17._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar17._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar17._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar17._12_4_ * 0.99999964;
  auVar17 = vpmaxsd_avx(auVar121,auVar227);
  auVar185 = vpmaxsd_avx(auVar251,auVar204);
  auVar17 = vminps_avx(auVar17,auVar185);
  auVar185 = vpmaxsd_avx(auVar273,auVar96);
  fVar316 = ray->tfar;
  auVar179._4_4_ = fVar316;
  auVar179._0_4_ = fVar316;
  auVar179._8_4_ = fVar316;
  auVar179._12_4_ = fVar316;
  auVar185 = vminps_avx(auVar185,auVar179);
  auVar17 = vminps_avx(auVar17,auVar185);
  auVar97._0_4_ = auVar17._0_4_ * 1.0000004;
  auVar97._4_4_ = auVar17._4_4_ * 1.0000004;
  auVar97._8_4_ = auVar17._8_4_ * 1.0000004;
  auVar97._12_4_ = auVar17._12_4_ * 1.0000004;
  auVar17 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar185 = vpcmpgtd_avx(auVar17,_DAT_01f4ad30);
  auVar17 = vcmpps_avx(local_5a0,auVar97,2);
  auVar17 = vandps_avx(auVar17,auVar185);
  uVar89 = vmovmskps_avx(auVar17);
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  auVar201 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
LAB_0092432c:
  local_7a8 = (ulong)uVar89;
  if (local_7a8 == 0) {
LAB_00926de8:
    return local_7a8 != 0;
  }
  lVar86 = 0;
  if (local_7a8 != 0) {
    for (; (uVar89 >> lVar86 & 1) == 0; lVar86 = lVar86 + 1) {
    }
  }
  uVar89 = *(uint *)(prim + 2);
  local_8a8 = (ulong)*(uint *)(prim + lVar86 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar89].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_8a8 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar316 = (pGVar12->time_range).lower;
  fVar316 = pGVar12->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar316) / ((pGVar12->time_range).upper - fVar316));
  auVar17 = vroundss_avx(ZEXT416((uint)fVar316),ZEXT416((uint)fVar316),9);
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar17 = vmaxss_avx(ZEXT816(0) << 0x20,auVar17);
  fVar316 = fVar316 - auVar17._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar87 = (long)(int)auVar17._0_4_ * 0x38;
  lVar86 = *(long *)(_Var13 + lVar87);
  lVar14 = *(long *)(_Var13 + 0x10 + lVar87);
  auVar17 = vshufps_avx(ZEXT416((uint)(1.0 - fVar316)),ZEXT416((uint)(1.0 - fVar316)),0);
  pfVar1 = (float *)(lVar86 + lVar14 * uVar83);
  fVar143 = auVar17._0_4_;
  fVar325 = auVar17._4_4_;
  fVar327 = auVar17._8_4_;
  fVar329 = auVar17._12_4_;
  pfVar2 = (float *)(lVar86 + lVar14 * (uVar83 + 1));
  pfVar3 = (float *)(lVar86 + lVar14 * (uVar83 + 2));
  pfVar4 = (float *)(lVar86 + lVar14 * (uVar83 + 3));
  lVar86 = *(long *)(_Var13 + 0x38 + lVar87);
  lVar14 = *(long *)(_Var13 + 0x48 + lVar87);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar316),ZEXT416((uint)fVar316),0);
  pfVar5 = (float *)(lVar86 + uVar83 * lVar14);
  fVar160 = auVar17._0_4_;
  fVar270 = auVar17._4_4_;
  fVar278 = auVar17._8_4_;
  fVar279 = auVar17._12_4_;
  pfVar6 = (float *)(lVar86 + (uVar83 + 1) * lVar14);
  auVar180._0_4_ = fVar160 * *pfVar5 + fVar143 * *pfVar1;
  auVar180._4_4_ = fVar270 * pfVar5[1] + fVar325 * pfVar1[1];
  auVar180._8_4_ = fVar278 * pfVar5[2] + fVar327 * pfVar1[2];
  auVar180._12_4_ = fVar279 * pfVar5[3] + fVar329 * pfVar1[3];
  auVar205._0_4_ = fVar143 * *pfVar2 + fVar160 * *pfVar6;
  auVar205._4_4_ = fVar325 * pfVar2[1] + fVar270 * pfVar6[1];
  auVar205._8_4_ = fVar327 * pfVar2[2] + fVar278 * pfVar6[2];
  auVar205._12_4_ = fVar329 * pfVar2[3] + fVar279 * pfVar6[3];
  auVar98._0_4_ = (auVar180._0_4_ + auVar205._0_4_) * 0.5;
  auVar98._4_4_ = (auVar180._4_4_ + auVar205._4_4_) * 0.5;
  auVar98._8_4_ = (auVar180._8_4_ + auVar205._8_4_) * 0.5;
  auVar98._12_4_ = (auVar180._12_4_ + auVar205._12_4_) * 0.5;
  aVar8 = (ray->org).field_0.field_1;
  aVar9 = (ray->dir).field_0.field_1;
  auVar17 = vsubps_avx(auVar98,(undefined1  [16])aVar8);
  auVar17 = vdpps_avx(auVar17,(undefined1  [16])aVar9,0x7f);
  auVar185 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
  pfVar1 = (float *)(lVar86 + (uVar83 + 2) * lVar14);
  auVar228._0_4_ = fVar160 * *pfVar1 + fVar143 * *pfVar3;
  auVar228._4_4_ = fVar270 * pfVar1[1] + fVar325 * pfVar3[1];
  auVar228._8_4_ = fVar278 * pfVar1[2] + fVar327 * pfVar3[2];
  auVar228._12_4_ = fVar279 * pfVar1[3] + fVar329 * pfVar3[3];
  auVar206 = vrcpss_avx(auVar185,auVar185);
  auVar324 = ZEXT464(0x40000000);
  fVar316 = auVar206._0_4_ * (2.0 - auVar185._0_4_ * auVar206._0_4_) * auVar17._0_4_;
  local_7c0 = ZEXT416((uint)fVar316);
  auVar185 = vshufps_avx(local_7c0,ZEXT416((uint)fVar316),0);
  fVar316 = aVar9.x;
  fVar150 = aVar9.y;
  fVar155 = aVar9.z;
  aVar148 = aVar9.field_3;
  auVar274._0_4_ = fVar316 * auVar185._0_4_ + aVar8.x;
  auVar274._4_4_ = fVar150 * auVar185._4_4_ + aVar8.y;
  auVar274._8_4_ = fVar155 * auVar185._8_4_ + aVar8.z;
  auVar274._12_4_ = aVar148.w * auVar185._12_4_ + aVar8.field_3.w;
  auVar17 = vblendps_avx(auVar274,_DAT_01f45a50,8);
  auVar16 = vsubps_avx(auVar180,auVar17);
  auVar288 = ZEXT1664(auVar16);
  _local_980 = vsubps_avx(auVar228,auVar17);
  pfVar1 = (float *)(lVar86 + lVar14 * (uVar83 + 3));
  auVar161._0_4_ = fVar143 * *pfVar4 + fVar160 * *pfVar1;
  auVar161._4_4_ = fVar325 * pfVar4[1] + fVar270 * pfVar1[1];
  auVar161._8_4_ = fVar327 * pfVar4[2] + fVar278 * pfVar1[2];
  auVar161._12_4_ = fVar329 * pfVar4[3] + fVar279 * pfVar1[3];
  _local_990 = vsubps_avx(auVar205,auVar17);
  _local_9a0 = vsubps_avx(auVar161,auVar17);
  auVar17 = vshufps_avx(auVar16,auVar16,0);
  auVar206 = vshufps_avx(auVar16,auVar16,0x55);
  register0x00001290 = auVar206;
  _local_3c0 = auVar206;
  auVar206 = vshufps_avx(auVar16,auVar16,0xaa);
  register0x00001290 = auVar206;
  _local_1e0 = auVar206;
  auVar206 = vshufps_avx(auVar16,auVar16,0xff);
  register0x00001290 = auVar206;
  _local_200 = auVar206;
  auVar206 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar206;
  _local_3e0 = auVar206;
  auVar206 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar206;
  _local_400 = auVar206;
  auVar206 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar206;
  _local_420 = auVar206;
  auVar122._0_4_ = fVar316 * fVar316;
  auVar122._4_4_ = fVar150 * fVar150;
  auVar122._8_4_ = fVar155 * fVar155;
  auVar122._12_4_ = aVar148.w * aVar148.w;
  auVar206 = vshufps_avx(auVar122,auVar122,0xaa);
  auVar182 = vshufps_avx(auVar122,auVar122,0x55);
  auVar101 = vshufps_avx(_local_990,_local_990,0xff);
  register0x000012d0 = auVar101;
  _local_220 = auVar101;
  auVar101 = vshufps_avx(auVar122,auVar122,0);
  auVar216._0_4_ = auVar101._0_4_ + auVar182._0_4_ + auVar206._0_4_;
  auVar216._4_4_ = auVar101._4_4_ + auVar182._4_4_ + auVar206._4_4_;
  auVar216._8_4_ = auVar101._8_4_ + auVar182._8_4_ + auVar206._8_4_;
  auVar216._12_4_ = auVar101._12_4_ + auVar182._12_4_ + auVar206._12_4_;
  auVar216._16_4_ = auVar101._0_4_ + auVar182._0_4_ + auVar206._0_4_;
  auVar216._20_4_ = auVar101._4_4_ + auVar182._4_4_ + auVar206._4_4_;
  auVar216._24_4_ = auVar101._8_4_ + auVar182._8_4_ + auVar206._8_4_;
  auVar216._28_4_ = auVar101._12_4_ + auVar182._12_4_ + auVar206._12_4_;
  auVar206 = vshufps_avx(_local_980,_local_980,0);
  register0x00001550 = auVar206;
  _local_8a0 = auVar206;
  auVar372 = ZEXT3264(_local_8a0);
  auVar206 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar206;
  _local_440 = auVar206;
  auVar206 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar206;
  _local_460 = auVar206;
  auVar206 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar206;
  _local_480 = auVar206;
  auVar206 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x000014d0 = auVar206;
  _local_920 = auVar206;
  auVar342 = ZEXT3264(_local_920);
  auVar206 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001510 = auVar206;
  _local_940 = auVar206;
  auVar355 = ZEXT3264(_local_940);
  auVar206 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar206;
  _local_4a0 = auVar206;
  auVar206 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar206;
  _local_260 = auVar206;
  register0x00001210 = auVar185;
  _local_6e0 = auVar185;
  uVar83 = 0;
  bVar91 = 0;
  local_b24 = 1;
  local_5e0 = (ray->dir).field_0.m128[0];
  local_5c0 = (ray->dir).field_0.m128[1];
  local_600 = (ray->dir).field_0.m128[2];
  local_4c0 = vandps_avx(auVar201._0_32_,auVar216);
  local_590 = ZEXT816(0x3f80000000000000);
  local_240 = auVar216;
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  fStack_5dc = local_5e0;
  fStack_5d8 = local_5e0;
  fStack_5d4 = local_5e0;
  fStack_5d0 = local_5e0;
  fStack_5cc = local_5e0;
  fStack_5c8 = local_5e0;
  fStack_5c4 = local_5e0;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  do {
    auVar185 = vmovshdup_avx(local_590);
    auVar182 = vsubps_avx(auVar185,local_590);
    auVar185 = vshufps_avx(local_590,local_590,0);
    local_860._16_16_ = auVar185;
    local_860._0_16_ = auVar185;
    auVar206 = vshufps_avx(auVar182,auVar182,0);
    local_880._16_16_ = auVar206;
    local_880._0_16_ = auVar206;
    fVar118 = auVar206._0_4_;
    fVar142 = auVar206._4_4_;
    fVar145 = auVar206._8_4_;
    fVar149 = auVar206._12_4_;
    fVar387 = auVar185._0_4_;
    auVar193._0_4_ = fVar387 + fVar118 * 0.0;
    fVar392 = auVar185._4_4_;
    auVar193._4_4_ = fVar392 + fVar142 * 0.14285715;
    fVar397 = auVar185._8_4_;
    auVar193._8_4_ = fVar397 + fVar145 * 0.2857143;
    fStack_ac4 = auVar185._12_4_;
    auVar193._12_4_ = fStack_ac4 + fVar149 * 0.42857146;
    auVar193._16_4_ = fVar387 + fVar118 * 0.5714286;
    auVar193._20_4_ = fVar392 + fVar142 * 0.71428573;
    auVar193._24_4_ = fVar397 + fVar145 * 0.8571429;
    auVar193._28_4_ = fStack_ac4 + fVar149;
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = 0x3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar130,auVar193);
    local_ae0._4_4_ = auVar193._4_4_ * auVar193._4_4_;
    local_ae0._0_4_ = auVar193._0_4_ * auVar193._0_4_;
    fStack_ad8 = auVar193._8_4_ * auVar193._8_4_;
    fStack_ad4 = auVar193._12_4_ * auVar193._12_4_;
    fStack_ad0 = auVar193._16_4_ * auVar193._16_4_;
    fStack_acc = auVar193._20_4_ * auVar193._20_4_;
    fStack_ac8 = auVar193._24_4_ * auVar193._24_4_;
    fVar278 = auVar193._0_4_ * 3.0;
    fVar279 = auVar193._4_4_ * 3.0;
    fVar280 = auVar193._8_4_ * 3.0;
    fVar247 = auVar193._12_4_ * 3.0;
    fVar255 = auVar193._16_4_ * 3.0;
    fVar261 = auVar193._20_4_ * 3.0;
    fVar224 = auVar193._24_4_ * 3.0;
    fVar143 = auVar110._0_4_;
    auVar201._0_4_ = fVar143 * fVar143;
    fVar325 = auVar110._4_4_;
    auVar201._4_4_ = fVar325 * fVar325;
    fVar150 = auVar110._8_4_;
    auVar201._8_4_ = fVar150 * fVar150;
    fVar327 = auVar110._12_4_;
    auVar201._12_4_ = fVar327 * fVar327;
    fVar155 = auVar110._16_4_;
    auVar201._16_4_ = fVar155 * fVar155;
    fVar329 = auVar110._20_4_;
    auVar201._20_4_ = fVar329 * fVar329;
    fVar160 = auVar110._24_4_;
    auVar201._28_36_ = auVar288._28_36_;
    auVar201._24_4_ = fVar160 * fVar160;
    fVar270 = auVar110._28_4_;
    fVar258 = (auVar201._0_4_ * (fVar143 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar241 = (auVar201._4_4_ * (fVar325 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar242 = (auVar201._8_4_ * (fVar150 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar243 = (auVar201._12_4_ * (fVar327 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar244 = (auVar201._16_4_ * (fVar155 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar245 = (auVar201._20_4_ * (fVar329 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar246 = (auVar201._24_4_ * (fVar160 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar289 = -fVar143 * auVar193._0_4_ * auVar193._0_4_ * 0.5;
    fVar296 = -fVar325 * auVar193._4_4_ * auVar193._4_4_ * 0.5;
    fVar299 = -fVar150 * auVar193._8_4_ * auVar193._8_4_ * 0.5;
    fVar302 = -fVar327 * auVar193._12_4_ * auVar193._12_4_ * 0.5;
    fVar305 = -fVar155 * auVar193._16_4_ * auVar193._16_4_ * 0.5;
    fVar308 = -fVar329 * auVar193._20_4_ * auVar193._20_4_ * 0.5;
    fVar311 = -fVar160 * auVar193._24_4_ * auVar193._24_4_ * 0.5;
    fVar316 = auVar372._28_4_;
    fVar334 = auVar324._28_4_ + fVar316;
    fVar349 = auVar342._28_4_ + fVar316;
    fVar368 = (auVar193._0_4_ * auVar193._0_4_ * (fVar278 + -5.0) + 2.0) * 0.5;
    fVar373 = (auVar193._4_4_ * auVar193._4_4_ * (fVar279 + -5.0) + 2.0) * 0.5;
    fVar374 = (auVar193._8_4_ * auVar193._8_4_ * (fVar280 + -5.0) + 2.0) * 0.5;
    fVar375 = (auVar193._12_4_ * auVar193._12_4_ * (fVar247 + -5.0) + 2.0) * 0.5;
    fVar376 = (auVar193._16_4_ * auVar193._16_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar377 = (auVar193._20_4_ * auVar193._20_4_ * (fVar261 + -5.0) + 2.0) * 0.5;
    fVar378 = (auVar193._24_4_ * auVar193._24_4_ * (fVar224 + -5.0) + 2.0) * 0.5;
    fVar350 = -auVar193._0_4_ * fVar143 * fVar143 * 0.5;
    fVar356 = -auVar193._4_4_ * fVar325 * fVar325 * 0.5;
    fVar358 = -auVar193._8_4_ * fVar150 * fVar150 * 0.5;
    fVar360 = -auVar193._12_4_ * fVar327 * fVar327 * 0.5;
    fVar362 = -auVar193._16_4_ * fVar155 * fVar155 * 0.5;
    fVar364 = -auVar193._20_4_ * fVar329 * fVar329 * 0.5;
    fVar366 = -auVar193._24_4_ * fVar160 * fVar160 * 0.5;
    fVar146 = auVar17._0_4_;
    fVar151 = auVar17._4_4_;
    fVar153 = auVar17._8_4_;
    fVar290 = fVar146 * fVar350 +
              fVar368 * (float)local_3e0._0_4_ + auVar342._0_4_ * fVar289 + auVar372._0_4_ * fVar258
    ;
    fVar297 = fVar151 * fVar356 +
              fVar373 * (float)local_3e0._4_4_ + auVar342._4_4_ * fVar296 + auVar372._4_4_ * fVar241
    ;
    fVar300 = fVar153 * fVar358 +
              fVar374 * fStack_3d8 + auVar342._8_4_ * fVar299 + auVar372._8_4_ * fVar242;
    fVar303 = auVar17._12_4_ * fVar360 +
              fVar375 * fStack_3d4 + auVar342._12_4_ * fVar302 + auVar372._12_4_ * fVar243;
    fVar306 = fVar146 * fVar362 +
              fVar376 * fStack_3d0 + auVar342._16_4_ * fVar305 + auVar372._16_4_ * fVar244;
    fVar309 = fVar151 * fVar364 +
              fVar377 * fStack_3cc + auVar342._20_4_ * fVar308 + auVar372._20_4_ * fVar245;
    fVar312 = fVar153 * fVar366 +
              fVar378 * fStack_3c8 + auVar342._24_4_ * fVar311 + auVar372._24_4_ * fVar246;
    fVar314 = fVar316 + 2.0 + -fVar270 + fVar334;
    fVar291 = fVar350 * (float)local_3c0._0_4_ +
              fVar368 * (float)local_400._0_4_ +
              auVar355._0_4_ * fVar289 + fVar258 * (float)local_440._0_4_;
    fVar298 = fVar356 * (float)local_3c0._4_4_ +
              fVar373 * (float)local_400._4_4_ +
              auVar355._4_4_ * fVar296 + fVar241 * (float)local_440._4_4_;
    fVar301 = fVar358 * fStack_3b8 +
              fVar374 * fStack_3f8 + auVar355._8_4_ * fVar299 + fVar242 * fStack_438;
    fVar304 = fVar360 * fStack_3b4 +
              fVar375 * fStack_3f4 + auVar355._12_4_ * fVar302 + fVar243 * fStack_434;
    fVar307 = fVar362 * fStack_3b0 +
              fVar376 * fStack_3f0 + auVar355._16_4_ * fVar305 + fVar244 * fStack_430;
    fVar310 = fVar364 * fStack_3ac +
              fVar377 * fStack_3ec + auVar355._20_4_ * fVar308 + fVar245 * fStack_42c;
    fVar313 = fVar366 * fStack_3a8 +
              fVar378 * fStack_3e8 + auVar355._24_4_ * fVar311 + fVar246 * fStack_428;
    fVar315 = fVar314 + fVar334 + fVar349;
    fVar159 = (float)local_1e0._0_4_ * fVar350 +
              fVar368 * (float)local_420._0_4_ +
              fVar289 * (float)local_4a0._0_4_ + fVar258 * (float)local_460._0_4_;
    fVar175 = (float)local_1e0._4_4_ * fVar356 +
              fVar373 * (float)local_420._4_4_ +
              fVar296 * (float)local_4a0._4_4_ + fVar241 * (float)local_460._4_4_;
    fVar176 = fStack_1d8 * fVar358 +
              fVar374 * fStack_418 + fVar299 * fStack_498 + fVar242 * fStack_458;
    fVar177 = fStack_1d4 * fVar360 +
              fVar375 * fStack_414 + fVar302 * fStack_494 + fVar243 * fStack_454;
    fStack_7d0 = fStack_1d0 * fVar362 +
                 fVar376 * fStack_410 + fVar305 * fStack_490 + fVar244 * fStack_450;
    fStack_7cc = fStack_1cc * fVar364 +
                 fVar377 * fStack_40c + fVar308 * fStack_48c + fVar245 * fStack_44c;
    fStack_7c8 = fStack_1c8 * fVar366 +
                 fVar378 * fStack_408 + fVar311 * fStack_488 + fVar246 * fStack_448;
    fStack_7c4 = fVar315 + fVar349 + auVar355._28_4_ + fVar316;
    local_700._0_4_ =
         (float)local_200._0_4_ * fVar350 +
         (float)local_220._0_4_ * fVar368 +
         fVar289 * (float)local_260._0_4_ + fVar258 * (float)local_480._0_4_;
    local_700._4_4_ =
         (float)local_200._4_4_ * fVar356 +
         (float)local_220._4_4_ * fVar373 +
         fVar296 * (float)local_260._4_4_ + fVar241 * (float)local_480._4_4_;
    local_700._8_4_ =
         fStack_1f8 * fVar358 + fStack_218 * fVar374 + fVar299 * fStack_258 + fVar242 * fStack_478;
    local_700._12_4_ =
         fStack_1f4 * fVar360 + fStack_214 * fVar375 + fVar302 * fStack_254 + fVar243 * fStack_474;
    local_700._16_4_ =
         fStack_1f0 * fVar362 + fStack_210 * fVar376 + fVar305 * fStack_250 + fVar244 * fStack_470;
    local_700._20_4_ =
         fStack_1ec * fVar364 + fStack_20c * fVar377 + fVar308 * fStack_24c + fVar245 * fStack_46c;
    local_700._24_4_ =
         fStack_1e8 * fVar366 + fStack_208 * fVar378 + fVar311 * fStack_248 + fVar246 * fStack_468;
    local_700._28_4_ = fVar315 + fVar316 + 2.0 + -fVar270 + -3.0;
    fVar366 = fVar270 + fVar270;
    fVar335 = auVar193._28_4_ + auVar193._28_4_;
    auVar197._4_4_ = (fVar325 + fVar325) * auVar193._4_4_;
    auVar197._0_4_ = (fVar143 + fVar143) * auVar193._0_4_;
    auVar197._8_4_ = (fVar150 + fVar150) * auVar193._8_4_;
    auVar197._12_4_ = (fVar327 + fVar327) * auVar193._12_4_;
    auVar197._16_4_ = (fVar155 + fVar155) * auVar193._16_4_;
    auVar197._20_4_ = (fVar329 + fVar329) * auVar193._20_4_;
    auVar197._24_4_ = (fVar160 + fVar160) * auVar193._24_4_;
    auVar197._28_4_ = fVar335;
    auVar110 = vsubps_avx(auVar197,auVar201._0_32_);
    auVar134._4_4_ = (fVar325 + fVar325) * (fVar279 + 2.0);
    auVar134._0_4_ = (fVar143 + fVar143) * (fVar278 + 2.0);
    auVar134._8_4_ = (fVar150 + fVar150) * (fVar280 + 2.0);
    auVar134._12_4_ = (fVar327 + fVar327) * (fVar247 + 2.0);
    auVar134._16_4_ = (fVar155 + fVar155) * (fVar255 + 2.0);
    auVar134._20_4_ = (fVar329 + fVar329) * (fVar261 + 2.0);
    auVar134._24_4_ = (fVar160 + fVar160) * (fVar224 + 2.0);
    auVar134._28_4_ = auVar216._28_4_ + 2.0;
    auVar21._4_4_ = fVar325 * fVar325 * 3.0;
    auVar21._0_4_ = fVar143 * fVar143 * 3.0;
    auVar21._8_4_ = fVar150 * fVar150 * 3.0;
    auVar21._12_4_ = fVar327 * fVar327 * 3.0;
    auVar21._16_4_ = fVar155 * fVar155 * 3.0;
    auVar21._20_4_ = fVar329 * fVar329 * 3.0;
    auVar21._24_4_ = fVar160 * fVar160 * 3.0;
    auVar21._28_4_ = fVar270;
    auVar134 = vsubps_avx(auVar134,auVar21);
    auVar197 = vsubps_avx(_local_ae0,auVar197);
    fVar302 = auVar110._0_4_ * 0.5;
    fVar305 = auVar110._4_4_ * 0.5;
    fVar308 = auVar110._8_4_ * 0.5;
    fVar311 = auVar110._12_4_ * 0.5;
    fVar334 = auVar110._16_4_ * 0.5;
    fVar349 = auVar110._20_4_ * 0.5;
    fVar350 = auVar110._24_4_ * 0.5;
    fVar278 = (auVar193._0_4_ * fVar278 + (auVar193._0_4_ + auVar193._0_4_) * (fVar278 + -5.0)) *
              0.5;
    fVar279 = (auVar193._4_4_ * fVar279 + (auVar193._4_4_ + auVar193._4_4_) * (fVar279 + -5.0)) *
              0.5;
    fVar258 = (auVar193._8_4_ * fVar280 + (auVar193._8_4_ + auVar193._8_4_) * (fVar280 + -5.0)) *
              0.5;
    fVar242 = (auVar193._12_4_ * fVar247 + (auVar193._12_4_ + auVar193._12_4_) * (fVar247 + -5.0)) *
              0.5;
    fVar245 = (auVar193._16_4_ * fVar255 + (auVar193._16_4_ + auVar193._16_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar246 = (auVar193._20_4_ * fVar261 + (auVar193._20_4_ + auVar193._20_4_) * (fVar261 + -5.0)) *
              0.5;
    fVar289 = (auVar193._24_4_ * fVar224 + (auVar193._24_4_ + auVar193._24_4_) * (fVar224 + -5.0)) *
              0.5;
    fVar316 = auVar134._0_4_ * 0.5;
    fVar143 = auVar134._4_4_ * 0.5;
    fVar325 = auVar134._8_4_ * 0.5;
    fVar150 = auVar134._12_4_ * 0.5;
    fVar327 = auVar134._16_4_ * 0.5;
    fVar155 = auVar134._20_4_ * 0.5;
    fVar329 = auVar134._24_4_ * 0.5;
    fVar160 = auVar197._0_4_ * 0.5;
    fVar270 = auVar197._4_4_ * 0.5;
    fVar280 = auVar197._8_4_ * 0.5;
    fVar247 = auVar197._12_4_ * 0.5;
    fVar255 = auVar197._16_4_ * 0.5;
    fVar224 = auVar197._20_4_ * 0.5;
    fVar241 = auVar197._24_4_ * 0.5;
    fVar299 = auVar193._28_4_ + auVar216._28_4_ + -5.0 + auVar197._28_4_ + fVar366 + 0.5;
    auVar185 = vpermilps_avx(ZEXT416((uint)(auVar182._0_4_ * 0.04761905)),0);
    fVar243 = auVar185._0_4_;
    fVar336 = fVar243 * (fVar146 * fVar302 +
                        fVar278 * (float)local_3e0._0_4_ +
                        fVar316 * (float)local_8a0._0_4_ + fVar160 * (float)local_920._0_4_);
    fVar244 = auVar185._4_4_;
    fVar343 = fVar244 * (fVar151 * fVar305 +
                        fVar279 * (float)local_3e0._4_4_ +
                        fVar143 * (float)local_8a0._4_4_ + fVar270 * (float)local_920._4_4_);
    local_800._4_4_ = fVar343;
    local_800._0_4_ = fVar336;
    fVar296 = auVar185._8_4_;
    fVar344 = fVar296 * (fVar153 * fVar308 +
                        fVar258 * fStack_3d8 + fVar325 * fStack_898 + fVar280 * fStack_918);
    local_800._8_4_ = fVar344;
    fVar261 = auVar185._12_4_;
    fVar345 = fVar261 * (auVar17._12_4_ * fVar311 +
                        fVar242 * fStack_3d4 + fVar150 * fStack_894 + fVar247 * fStack_914);
    local_800._12_4_ = fVar345;
    fVar346 = fVar243 * (fVar146 * fVar334 +
                        fVar245 * fStack_3d0 + fVar327 * fStack_890 + fVar255 * fStack_910);
    local_800._16_4_ = fVar346;
    fVar347 = fVar244 * (fVar151 * fVar349 +
                        fVar246 * fStack_3cc + fVar155 * fStack_88c + fVar224 * fStack_90c);
    local_800._20_4_ = fVar347;
    fVar348 = fVar296 * (fVar153 * fVar350 +
                        fVar289 * fStack_3c8 + fVar329 * fStack_888 + fVar241 * fStack_908);
    local_800._24_4_ = fVar348;
    local_800._28_4_ = uStack_1c4;
    local_a40._0_4_ =
         fVar243 * (fVar302 * (float)local_3c0._0_4_ +
                   fVar278 * (float)local_400._0_4_ +
                   fVar316 * (float)local_440._0_4_ + fVar160 * (float)local_940._0_4_);
    local_a40._4_4_ =
         fVar244 * (fVar305 * (float)local_3c0._4_4_ +
                   fVar279 * (float)local_400._4_4_ +
                   fVar143 * (float)local_440._4_4_ + fVar270 * (float)local_940._4_4_);
    local_a40._8_4_ =
         fVar296 * (fVar308 * fStack_3b8 +
                   fVar258 * fStack_3f8 + fVar325 * fStack_438 + fVar280 * fStack_938);
    local_a40._12_4_ =
         fVar261 * (fVar311 * fStack_3b4 +
                   fVar242 * fStack_3f4 + fVar150 * fStack_434 + fVar247 * fStack_934);
    local_a40._16_4_ =
         fVar243 * (fVar334 * fStack_3b0 +
                   fVar245 * fStack_3f0 + fVar327 * fStack_430 + fVar255 * fStack_930);
    local_a40._20_4_ =
         fVar244 * (fVar349 * fStack_3ac +
                   fVar246 * fStack_3ec + fVar155 * fStack_42c + fVar224 * fStack_92c);
    local_a40._24_4_ =
         fVar296 * (fVar350 * fStack_3a8 +
                   fVar289 * fStack_3e8 + fVar329 * fStack_428 + fVar241 * fStack_928);
    local_a40._28_4_ = 0;
    fVar317 = fVar243 * ((float)local_1e0._0_4_ * fVar302 +
                        fVar316 * (float)local_460._0_4_ + fVar160 * (float)local_4a0._0_4_ +
                        fVar278 * (float)local_420._0_4_);
    fVar326 = fVar244 * ((float)local_1e0._4_4_ * fVar305 +
                        fVar143 * (float)local_460._4_4_ + fVar270 * (float)local_4a0._4_4_ +
                        fVar279 * (float)local_420._4_4_);
    auVar196._4_4_ = fVar326;
    auVar196._0_4_ = fVar317;
    fVar328 = fVar296 * (fStack_1d8 * fVar308 +
                        fVar325 * fStack_458 + fVar280 * fStack_498 + fVar258 * fStack_418);
    auVar196._8_4_ = fVar328;
    fVar330 = fVar261 * (fStack_1d4 * fVar311 +
                        fVar150 * fStack_454 + fVar247 * fStack_494 + fVar242 * fStack_414);
    auVar196._12_4_ = fVar330;
    fVar331 = fVar243 * (fStack_1d0 * fVar334 +
                        fVar327 * fStack_450 + fVar255 * fStack_490 + fVar245 * fStack_410);
    auVar196._16_4_ = fVar331;
    fVar332 = fVar244 * (fStack_1cc * fVar349 +
                        fVar155 * fStack_44c + fVar224 * fStack_48c + fVar246 * fStack_40c);
    auVar196._20_4_ = fVar332;
    fVar333 = fVar296 * (fStack_1c8 * fVar350 +
                        fVar329 * fStack_448 + fVar241 * fStack_488 + fVar289 * fStack_408);
    auVar196._24_4_ = fVar333;
    auVar196._28_4_ = fVar335;
    fVar278 = fVar243 * ((float)local_200._0_4_ * fVar302 +
                        (float)local_220._0_4_ * fVar278 +
                        fVar316 * (float)local_480._0_4_ + (float)local_260._0_4_ * fVar160);
    fVar279 = fVar244 * ((float)local_200._4_4_ * fVar305 +
                        (float)local_220._4_4_ * fVar279 +
                        fVar143 * (float)local_480._4_4_ + (float)local_260._4_4_ * fVar270);
    auVar22._4_4_ = fVar279;
    auVar22._0_4_ = fVar278;
    fVar258 = fVar296 * (fStack_1f8 * fVar308 +
                        fStack_218 * fVar258 + fVar325 * fStack_478 + fStack_258 * fVar280);
    auVar22._8_4_ = fVar258;
    fVar261 = fVar261 * (fStack_1f4 * fVar311 +
                        fStack_214 * fVar242 + fVar150 * fStack_474 + fStack_254 * fVar247);
    auVar22._12_4_ = fVar261;
    fVar243 = fVar243 * (fStack_1f0 * fVar334 +
                        fStack_210 * fVar245 + fVar327 * fStack_470 + fStack_250 * fVar255);
    auVar22._16_4_ = fVar243;
    fVar244 = fVar244 * (fStack_1ec * fVar349 +
                        fStack_20c * fVar246 + fVar155 * fStack_46c + fStack_24c * fVar224);
    auVar22._20_4_ = fVar244;
    fVar296 = fVar296 * (fStack_1e8 * fVar350 +
                        fStack_208 * fVar289 + fVar329 * fStack_468 + fStack_248 * fVar241);
    auVar22._24_4_ = fVar296;
    auVar22._28_4_ = fVar299;
    auVar24._4_4_ = fVar298;
    auVar24._0_4_ = fVar291;
    auVar24._8_4_ = fVar301;
    auVar24._12_4_ = fVar304;
    auVar24._16_4_ = fVar307;
    auVar24._20_4_ = fVar310;
    auVar24._24_4_ = fVar313;
    auVar24._28_4_ = fVar315;
    auVar110 = vperm2f128_avx(auVar24,auVar24,1);
    auVar110 = vshufps_avx(auVar110,auVar24,0x30);
    auVar197 = vshufps_avx(auVar24,auVar110,0x29);
    auVar78._4_4_ = fVar175;
    auVar78._0_4_ = fVar159;
    auVar78._8_4_ = fVar176;
    auVar78._12_4_ = fVar177;
    auVar78._16_4_ = fStack_7d0;
    auVar78._20_4_ = fStack_7cc;
    auVar78._24_4_ = fStack_7c8;
    auVar78._28_4_ = fStack_7c4;
    auVar110 = vperm2f128_avx(auVar78,auVar78,1);
    auVar110 = vshufps_avx(auVar110,auVar78,0x30);
    auVar21 = vshufps_avx(auVar78,auVar110,0x29);
    auVar216 = vsubps_avx(local_700,auVar22);
    auVar110 = vperm2f128_avx(auVar216,auVar216,1);
    auVar110 = vshufps_avx(auVar110,auVar216,0x30);
    local_720 = vshufps_avx(auVar216,auVar110,0x29);
    auVar24 = vsubps_avx(auVar197,auVar24);
    auVar25 = vsubps_avx(auVar21,auVar78);
    fVar143 = auVar24._0_4_;
    fVar329 = auVar24._4_4_;
    auVar26._4_4_ = fVar326 * fVar329;
    auVar26._0_4_ = fVar317 * fVar143;
    fVar280 = auVar24._8_4_;
    auVar26._8_4_ = fVar328 * fVar280;
    fVar224 = auVar24._12_4_;
    auVar26._12_4_ = fVar330 * fVar224;
    fVar245 = auVar24._16_4_;
    auVar26._16_4_ = fVar331 * fVar245;
    fVar302 = auVar24._20_4_;
    auVar26._20_4_ = fVar332 * fVar302;
    fVar349 = auVar24._24_4_;
    auVar26._24_4_ = fVar333 * fVar349;
    auVar26._28_4_ = auVar216._28_4_;
    fVar325 = auVar25._0_4_;
    fVar160 = auVar25._4_4_;
    auVar27._4_4_ = local_a40._4_4_ * fVar160;
    auVar27._0_4_ = (float)local_a40._0_4_ * fVar325;
    fVar247 = auVar25._8_4_;
    auVar27._8_4_ = local_a40._8_4_ * fVar247;
    fVar241 = auVar25._12_4_;
    auVar27._12_4_ = local_a40._12_4_ * fVar241;
    fVar246 = auVar25._16_4_;
    auVar27._16_4_ = local_a40._16_4_ * fVar246;
    fVar305 = auVar25._20_4_;
    auVar27._20_4_ = local_a40._20_4_ * fVar305;
    fVar350 = auVar25._24_4_;
    auVar27._24_4_ = local_a40._24_4_ * fVar350;
    auVar27._28_4_ = auVar110._28_4_;
    auVar134 = vsubps_avx(auVar27,auVar26);
    auVar74._4_4_ = fVar297;
    auVar74._0_4_ = fVar290;
    auVar74._8_4_ = fVar300;
    auVar74._12_4_ = fVar303;
    auVar74._16_4_ = fVar306;
    auVar74._20_4_ = fVar309;
    auVar74._24_4_ = fVar312;
    auVar74._28_4_ = fVar314;
    auVar110 = vperm2f128_avx(auVar74,auVar74,1);
    auVar110 = vshufps_avx(auVar110,auVar74,0x30);
    auVar22 = vshufps_avx(auVar74,auVar110,0x29);
    local_280 = vsubps_avx(auVar22,auVar74);
    auVar28._4_4_ = fVar343 * fVar160;
    auVar28._0_4_ = fVar336 * fVar325;
    auVar28._8_4_ = fVar344 * fVar247;
    auVar28._12_4_ = fVar345 * fVar241;
    auVar28._16_4_ = fVar346 * fVar246;
    auVar28._20_4_ = fVar347 * fVar305;
    auVar28._24_4_ = fVar348 * fVar350;
    auVar28._28_4_ = auVar22._28_4_;
    fVar150 = local_280._0_4_;
    fVar270 = local_280._4_4_;
    auVar283._4_4_ = fVar326 * fVar270;
    auVar283._0_4_ = fVar317 * fVar150;
    fVar255 = local_280._8_4_;
    auVar283._8_4_ = fVar328 * fVar255;
    fVar242 = local_280._12_4_;
    auVar283._12_4_ = fVar330 * fVar242;
    fVar289 = local_280._16_4_;
    auVar283._16_4_ = fVar331 * fVar289;
    fVar308 = local_280._20_4_;
    auVar283._20_4_ = fVar332 * fVar308;
    fVar356 = local_280._24_4_;
    auVar283._24_4_ = fVar333 * fVar356;
    auVar283._28_4_ = fVar314;
    auVar26 = vsubps_avx(auVar283,auVar28);
    auVar195._4_4_ = fVar270 * local_a40._4_4_;
    auVar195._0_4_ = fVar150 * (float)local_a40._0_4_;
    auVar195._8_4_ = fVar255 * local_a40._8_4_;
    auVar195._12_4_ = fVar242 * local_a40._12_4_;
    auVar195._16_4_ = fVar289 * local_a40._16_4_;
    auVar195._20_4_ = fVar308 * local_a40._20_4_;
    auVar195._24_4_ = fVar356 * local_a40._24_4_;
    auVar195._28_4_ = fVar314;
    auVar23._4_4_ = fVar343 * fVar329;
    auVar23._0_4_ = fVar336 * fVar143;
    auVar23._8_4_ = fVar344 * fVar280;
    auVar23._12_4_ = fVar345 * fVar224;
    auVar23._16_4_ = fVar346 * fVar245;
    auVar23._20_4_ = fVar347 * fVar302;
    auVar23._24_4_ = fVar348 * fVar349;
    auVar23._28_4_ = fVar366;
    auVar27 = vsubps_avx(auVar23,auVar195);
    fVar316 = auVar27._28_4_;
    fVar364 = auVar26._28_4_ + fVar316;
    auVar217._0_4_ = fVar150 * fVar150 + fVar143 * fVar143 + fVar325 * fVar325;
    auVar217._4_4_ = fVar270 * fVar270 + fVar329 * fVar329 + fVar160 * fVar160;
    auVar217._8_4_ = fVar255 * fVar255 + fVar280 * fVar280 + fVar247 * fVar247;
    auVar217._12_4_ = fVar242 * fVar242 + fVar224 * fVar224 + fVar241 * fVar241;
    auVar217._16_4_ = fVar289 * fVar289 + fVar245 * fVar245 + fVar246 * fVar246;
    auVar217._20_4_ = fVar308 * fVar308 + fVar302 * fVar302 + fVar305 * fVar305;
    auVar217._24_4_ = fVar356 * fVar356 + fVar349 * fVar349 + fVar350 * fVar350;
    auVar217._28_4_ = fVar316 + fVar316 + fVar364;
    auVar110 = vrcpps_avx(auVar217);
    fVar327 = auVar110._0_4_;
    fVar155 = auVar110._4_4_;
    auVar29._4_4_ = fVar155 * auVar217._4_4_;
    auVar29._0_4_ = fVar327 * auVar217._0_4_;
    fVar311 = auVar110._8_4_;
    auVar29._8_4_ = fVar311 * auVar217._8_4_;
    fVar334 = auVar110._12_4_;
    auVar29._12_4_ = fVar334 * auVar217._12_4_;
    fVar358 = auVar110._16_4_;
    auVar29._16_4_ = fVar358 * auVar217._16_4_;
    fVar360 = auVar110._20_4_;
    auVar29._20_4_ = fVar360 * auVar217._20_4_;
    fVar362 = auVar110._24_4_;
    auVar29._24_4_ = fVar362 * auVar217._24_4_;
    auVar29._28_4_ = fVar366;
    auVar353._8_4_ = 0x3f800000;
    auVar353._0_8_ = 0x3f8000003f800000;
    auVar353._12_4_ = 0x3f800000;
    auVar353._16_4_ = 0x3f800000;
    auVar353._20_4_ = 0x3f800000;
    auVar353._24_4_ = 0x3f800000;
    auVar353._28_4_ = 0x3f800000;
    auVar28 = vsubps_avx(auVar353,auVar29);
    fVar327 = auVar28._0_4_ * fVar327 + fVar327;
    fVar155 = auVar28._4_4_ * fVar155 + fVar155;
    fVar311 = auVar28._8_4_ * fVar311 + fVar311;
    fVar334 = auVar28._12_4_ * fVar334 + fVar334;
    fVar358 = auVar28._16_4_ * fVar358 + fVar358;
    fVar360 = auVar28._20_4_ * fVar360 + fVar360;
    fVar362 = auVar28._24_4_ * fVar362 + fVar362;
    auVar216 = vperm2f128_avx(local_a40,local_a40,1);
    auVar216 = vshufps_avx(auVar216,local_a40,0x30);
    local_9e0 = vshufps_avx(local_a40,auVar216,0x29);
    auVar216 = vperm2f128_avx(auVar196,auVar196,1);
    auVar216 = vshufps_avx(auVar216,auVar196,0x30);
    local_a00 = vshufps_avx(auVar196,auVar216,0x29);
    fVar379 = local_a00._0_4_;
    fVar383 = local_a00._4_4_;
    auVar30._4_4_ = fVar383 * fVar329;
    auVar30._0_4_ = fVar379 * fVar143;
    fVar385 = local_a00._8_4_;
    auVar30._8_4_ = fVar385 * fVar280;
    fVar388 = local_a00._12_4_;
    auVar30._12_4_ = fVar388 * fVar224;
    fVar390 = local_a00._16_4_;
    auVar30._16_4_ = fVar390 * fVar245;
    fVar393 = local_a00._20_4_;
    auVar30._20_4_ = fVar393 * fVar302;
    fVar395 = local_a00._24_4_;
    auVar30._24_4_ = fVar395 * fVar349;
    auVar30._28_4_ = auVar216._28_4_;
    fVar366 = local_9e0._0_4_;
    fVar368 = local_9e0._4_4_;
    auVar31._4_4_ = fVar368 * fVar160;
    auVar31._0_4_ = fVar366 * fVar325;
    fVar373 = local_9e0._8_4_;
    auVar31._8_4_ = fVar373 * fVar247;
    fVar374 = local_9e0._12_4_;
    auVar31._12_4_ = fVar374 * fVar241;
    fVar375 = local_9e0._16_4_;
    auVar31._16_4_ = fVar375 * fVar246;
    fVar376 = local_9e0._20_4_;
    auVar31._20_4_ = fVar376 * fVar305;
    fVar377 = local_9e0._24_4_;
    auVar31._24_4_ = fVar377 * fVar350;
    auVar31._28_4_ = fVar335;
    auVar196 = vsubps_avx(auVar31,auVar30);
    auVar216 = vperm2f128_avx(local_800,local_800,1);
    auVar216 = vshufps_avx(auVar216,local_800,0x30);
    local_820 = vshufps_avx(local_800,auVar216,0x29);
    fVar351 = local_820._0_4_;
    fVar357 = local_820._4_4_;
    auVar32._4_4_ = fVar357 * fVar160;
    auVar32._0_4_ = fVar351 * fVar325;
    fVar359 = local_820._8_4_;
    auVar32._8_4_ = fVar359 * fVar247;
    fVar361 = local_820._12_4_;
    auVar32._12_4_ = fVar361 * fVar241;
    fVar363 = local_820._16_4_;
    auVar32._16_4_ = fVar363 * fVar246;
    fVar365 = local_820._20_4_;
    auVar32._20_4_ = fVar365 * fVar305;
    fVar367 = local_820._24_4_;
    auVar32._24_4_ = fVar367 * fVar350;
    auVar32._28_4_ = auVar216._28_4_;
    auVar33._4_4_ = fVar383 * fVar270;
    auVar33._0_4_ = fVar379 * fVar150;
    auVar33._8_4_ = fVar385 * fVar255;
    auVar33._12_4_ = fVar388 * fVar242;
    auVar33._16_4_ = fVar390 * fVar289;
    auVar33._20_4_ = fVar393 * fVar308;
    auVar33._24_4_ = fVar395 * fVar356;
    auVar33._28_4_ = uStack_1c4;
    auVar216 = vsubps_avx(auVar33,auVar32);
    auVar34._4_4_ = fVar270 * fVar368;
    auVar34._0_4_ = fVar150 * fVar366;
    auVar34._8_4_ = fVar255 * fVar373;
    auVar34._12_4_ = fVar242 * fVar374;
    auVar34._16_4_ = fVar289 * fVar375;
    auVar34._20_4_ = fVar308 * fVar376;
    auVar34._24_4_ = fVar356 * fVar377;
    auVar34._28_4_ = uStack_1c4;
    auVar35._4_4_ = fVar357 * fVar329;
    auVar35._0_4_ = fVar351 * fVar143;
    auVar35._8_4_ = fVar359 * fVar280;
    auVar35._12_4_ = fVar361 * fVar224;
    auVar35._16_4_ = fVar363 * fVar245;
    auVar35._20_4_ = fVar365 * fVar302;
    auVar35._24_4_ = fVar367 * fVar349;
    auVar35._28_4_ = local_820._28_4_;
    auVar283 = vsubps_avx(auVar35,auVar34);
    fVar316 = auVar283._28_4_;
    fVar378 = auVar216._28_4_ + fVar316;
    auVar36._4_4_ =
         (auVar134._4_4_ * auVar134._4_4_ +
         auVar26._4_4_ * auVar26._4_4_ + auVar27._4_4_ * auVar27._4_4_) * fVar155;
    auVar36._0_4_ =
         (auVar134._0_4_ * auVar134._0_4_ +
         auVar26._0_4_ * auVar26._0_4_ + auVar27._0_4_ * auVar27._0_4_) * fVar327;
    auVar36._8_4_ =
         (auVar134._8_4_ * auVar134._8_4_ +
         auVar26._8_4_ * auVar26._8_4_ + auVar27._8_4_ * auVar27._8_4_) * fVar311;
    auVar36._12_4_ =
         (auVar134._12_4_ * auVar134._12_4_ +
         auVar26._12_4_ * auVar26._12_4_ + auVar27._12_4_ * auVar27._12_4_) * fVar334;
    auVar36._16_4_ =
         (auVar134._16_4_ * auVar134._16_4_ +
         auVar26._16_4_ * auVar26._16_4_ + auVar27._16_4_ * auVar27._16_4_) * fVar358;
    auVar36._20_4_ =
         (auVar134._20_4_ * auVar134._20_4_ +
         auVar26._20_4_ * auVar26._20_4_ + auVar27._20_4_ * auVar27._20_4_) * fVar360;
    auVar36._24_4_ =
         (auVar134._24_4_ * auVar134._24_4_ +
         auVar26._24_4_ * auVar26._24_4_ + auVar27._24_4_ * auVar27._24_4_) * fVar362;
    auVar36._28_4_ = auVar134._28_4_ + fVar364;
    auVar37._4_4_ =
         (auVar196._4_4_ * auVar196._4_4_ +
         auVar216._4_4_ * auVar216._4_4_ + auVar283._4_4_ * auVar283._4_4_) * fVar155;
    auVar37._0_4_ =
         (auVar196._0_4_ * auVar196._0_4_ +
         auVar216._0_4_ * auVar216._0_4_ + auVar283._0_4_ * auVar283._0_4_) * fVar327;
    auVar37._8_4_ =
         (auVar196._8_4_ * auVar196._8_4_ +
         auVar216._8_4_ * auVar216._8_4_ + auVar283._8_4_ * auVar283._8_4_) * fVar311;
    auVar37._12_4_ =
         (auVar196._12_4_ * auVar196._12_4_ +
         auVar216._12_4_ * auVar216._12_4_ + auVar283._12_4_ * auVar283._12_4_) * fVar334;
    auVar37._16_4_ =
         (auVar196._16_4_ * auVar196._16_4_ +
         auVar216._16_4_ * auVar216._16_4_ + auVar283._16_4_ * auVar283._16_4_) * fVar358;
    auVar37._20_4_ =
         (auVar196._20_4_ * auVar196._20_4_ +
         auVar216._20_4_ * auVar216._20_4_ + auVar283._20_4_ * auVar283._20_4_) * fVar360;
    auVar37._24_4_ =
         (auVar196._24_4_ * auVar196._24_4_ +
         auVar216._24_4_ * auVar216._24_4_ + auVar283._24_4_ * auVar283._24_4_) * fVar362;
    auVar37._28_4_ = auVar28._28_4_ + auVar110._28_4_;
    auVar110 = vmaxps_avx(auVar36,auVar37);
    auVar216 = vperm2f128_avx(local_700,local_700,1);
    auVar216 = vshufps_avx(auVar216,local_700,0x30);
    auVar26 = vshufps_avx(local_700,auVar216,0x29);
    auVar131._0_4_ = (float)local_700._0_4_ + fVar278;
    auVar131._4_4_ = local_700._4_4_ + fVar279;
    auVar131._8_4_ = local_700._8_4_ + fVar258;
    auVar131._12_4_ = local_700._12_4_ + fVar261;
    auVar131._16_4_ = local_700._16_4_ + fVar243;
    auVar131._20_4_ = local_700._20_4_ + fVar244;
    auVar131._24_4_ = local_700._24_4_ + fVar296;
    auVar131._28_4_ = local_700._28_4_ + fVar299;
    auVar216 = vmaxps_avx(local_700,auVar131);
    auVar134 = vmaxps_avx(local_720,auVar26);
    auVar216 = vmaxps_avx(auVar216,auVar134);
    auVar134 = vrsqrtps_avx(auVar217);
    fVar327 = auVar134._0_4_;
    fVar155 = auVar134._4_4_;
    fVar278 = auVar134._8_4_;
    fVar279 = auVar134._12_4_;
    fVar258 = auVar134._16_4_;
    fVar261 = auVar134._20_4_;
    fVar243 = auVar134._24_4_;
    auVar38._4_4_ = fVar155 * fVar155 * fVar155 * auVar217._4_4_ * 0.5;
    auVar38._0_4_ = fVar327 * fVar327 * fVar327 * auVar217._0_4_ * 0.5;
    auVar38._8_4_ = fVar278 * fVar278 * fVar278 * auVar217._8_4_ * 0.5;
    auVar38._12_4_ = fVar279 * fVar279 * fVar279 * auVar217._12_4_ * 0.5;
    auVar38._16_4_ = fVar258 * fVar258 * fVar258 * auVar217._16_4_ * 0.5;
    auVar38._20_4_ = fVar261 * fVar261 * fVar261 * auVar217._20_4_ * 0.5;
    auVar38._24_4_ = fVar243 * fVar243 * fVar243 * auVar217._24_4_ * 0.5;
    auVar38._28_4_ = auVar217._28_4_;
    auVar39._4_4_ = fVar155 * 1.5;
    auVar39._0_4_ = fVar327 * 1.5;
    auVar39._8_4_ = fVar278 * 1.5;
    auVar39._12_4_ = fVar279 * 1.5;
    auVar39._16_4_ = fVar258 * 1.5;
    auVar39._20_4_ = fVar261 * 1.5;
    auVar39._24_4_ = fVar243 * 1.5;
    auVar39._28_4_ = auVar134._28_4_;
    local_360 = vsubps_avx(auVar39,auVar38);
    auVar73._4_4_ = fVar298;
    auVar73._0_4_ = fVar291;
    auVar73._8_4_ = fVar301;
    auVar73._12_4_ = fVar304;
    auVar73._16_4_ = fVar307;
    auVar73._20_4_ = fVar310;
    auVar73._24_4_ = fVar313;
    auVar73._28_4_ = fVar315;
    local_840 = vsubps_avx(ZEXT832(0) << 0x20,auVar73);
    auVar134 = vsubps_avx(ZEXT832(0) << 0x20,auVar78);
    fVar380 = auVar134._0_4_;
    fVar384 = auVar134._4_4_;
    fVar386 = auVar134._8_4_;
    fVar389 = auVar134._12_4_;
    fVar391 = auVar134._16_4_;
    fVar394 = auVar134._20_4_;
    fVar362 = local_360._28_4_;
    fVar396 = auVar134._24_4_;
    fVar327 = local_840._0_4_;
    fVar278 = local_840._4_4_;
    fVar258 = local_840._8_4_;
    fVar243 = local_840._12_4_;
    fVar296 = local_840._16_4_;
    fVar311 = local_840._20_4_;
    fVar358 = local_840._24_4_;
    auVar75._4_4_ = fVar297;
    auVar75._0_4_ = fVar290;
    auVar75._8_4_ = fVar300;
    auVar75._12_4_ = fVar303;
    auVar75._16_4_ = fVar306;
    auVar75._20_4_ = fVar309;
    auVar75._24_4_ = fVar312;
    auVar75._28_4_ = fVar314;
    auVar283 = ZEXT832(0) << 0x20;
    auVar27 = vsubps_avx(auVar283,auVar75);
    fVar155 = auVar27._0_4_;
    fVar279 = auVar27._4_4_;
    fVar261 = auVar27._8_4_;
    fVar244 = auVar27._12_4_;
    fVar299 = auVar27._16_4_;
    fVar334 = auVar27._20_4_;
    fVar360 = auVar27._24_4_;
    auVar295._0_4_ = local_5e0 * fVar155 + local_5c0 * fVar327 + fVar380 * local_600;
    auVar295._4_4_ = fStack_5dc * fVar279 + fStack_5bc * fVar278 + fVar384 * fStack_5fc;
    auVar295._8_4_ = fStack_5d8 * fVar261 + fStack_5b8 * fVar258 + fVar386 * fStack_5f8;
    auVar295._12_4_ = fStack_5d4 * fVar244 + fStack_5b4 * fVar243 + fVar389 * fStack_5f4;
    auVar295._16_4_ = fStack_5d0 * fVar299 + fStack_5b0 * fVar296 + fVar391 * fStack_5f0;
    auVar295._20_4_ = fStack_5cc * fVar334 + fStack_5ac * fVar311 + fVar394 * fStack_5ec;
    auVar295._24_4_ = fStack_5c8 * fVar360 + fStack_5a8 * fVar358 + fVar396 * fStack_5e8;
    auVar295._28_4_ = fVar378 + auVar196._28_4_ + fVar378 + fVar362;
    auVar321._0_4_ = fVar155 * fVar155 + fVar327 * fVar327 + fVar380 * fVar380;
    auVar321._4_4_ = fVar279 * fVar279 + fVar278 * fVar278 + fVar384 * fVar384;
    auVar321._8_4_ = fVar261 * fVar261 + fVar258 * fVar258 + fVar386 * fVar386;
    auVar321._12_4_ = fVar244 * fVar244 + fVar243 * fVar243 + fVar389 * fVar389;
    auVar321._16_4_ = fVar299 * fVar299 + fVar296 * fVar296 + fVar391 * fVar391;
    auVar321._20_4_ = fVar334 * fVar334 + fVar311 * fVar311 + fVar394 * fVar394;
    auVar321._24_4_ = fVar360 * fVar360 + fVar358 * fVar358 + fVar396 * fVar396;
    auVar321._28_4_ = fVar316 + fVar316 + fVar378;
    fVar249 = local_360._0_4_;
    fVar257 = local_360._4_4_;
    fVar260 = local_360._8_4_;
    fVar263 = local_360._12_4_;
    fVar265 = local_360._16_4_;
    fVar267 = local_360._20_4_;
    fVar269 = local_360._24_4_;
    fVar364 = auVar25._28_4_;
    local_4e0 = local_5e0 * fVar150 * fVar249 +
                fVar249 * fVar143 * local_5c0 + fVar249 * fVar325 * local_600;
    fStack_4dc = fStack_5dc * fVar270 * fVar257 +
                 fVar257 * fVar329 * fStack_5bc + fVar257 * fVar160 * fStack_5fc;
    fStack_4d8 = fStack_5d8 * fVar255 * fVar260 +
                 fVar260 * fVar280 * fStack_5b8 + fVar260 * fVar247 * fStack_5f8;
    fStack_4d4 = fStack_5d4 * fVar242 * fVar263 +
                 fVar263 * fVar224 * fStack_5b4 + fVar263 * fVar241 * fStack_5f4;
    fStack_4d0 = fStack_5d0 * fVar289 * fVar265 +
                 fVar265 * fVar245 * fStack_5b0 + fVar265 * fVar246 * fStack_5f0;
    fStack_4cc = fStack_5cc * fVar308 * fVar267 +
                 fVar267 * fVar302 * fStack_5ac + fVar267 * fVar305 * fStack_5ec;
    fStack_4c8 = fStack_5c8 * fVar356 * fVar269 +
                 fVar269 * fVar349 * fStack_5a8 + fVar269 * fVar350 * fStack_5e8;
    fVar316 = auVar24._28_4_ + fVar364 + fStack_5e4;
    local_500 = fVar155 * fVar150 * fVar249 +
                fVar249 * fVar143 * fVar327 + fVar380 * fVar249 * fVar325;
    fStack_4fc = fVar279 * fVar270 * fVar257 +
                 fVar257 * fVar329 * fVar278 + fVar384 * fVar257 * fVar160;
    fStack_4f8 = fVar261 * fVar255 * fVar260 +
                 fVar260 * fVar280 * fVar258 + fVar386 * fVar260 * fVar247;
    fStack_4f4 = fVar244 * fVar242 * fVar263 +
                 fVar263 * fVar224 * fVar243 + fVar389 * fVar263 * fVar241;
    fStack_4f0 = fVar299 * fVar289 * fVar265 +
                 fVar265 * fVar245 * fVar296 + fVar391 * fVar265 * fVar246;
    fStack_4ec = fVar334 * fVar308 * fVar267 +
                 fVar267 * fVar302 * fVar311 + fVar394 * fVar267 * fVar305;
    fStack_4e8 = fVar360 * fVar356 * fVar269 +
                 fVar269 * fVar349 * fVar358 + fVar396 * fVar269 * fVar350;
    fStack_4e4 = fVar364 + fVar316;
    auVar25._4_4_ = fStack_4dc * fStack_4fc;
    auVar25._0_4_ = local_4e0 * local_500;
    auVar25._8_4_ = fStack_4d8 * fStack_4f8;
    auVar25._12_4_ = fStack_4d4 * fStack_4f4;
    auVar25._16_4_ = fStack_4d0 * fStack_4f0;
    auVar25._20_4_ = fStack_4cc * fStack_4ec;
    auVar25._24_4_ = fStack_4c8 * fStack_4e8;
    auVar25._28_4_ = fVar316;
    auVar25 = vsubps_avx(auVar295,auVar25);
    auVar40._4_4_ = fStack_4fc * fStack_4fc;
    auVar40._0_4_ = local_500 * local_500;
    auVar40._8_4_ = fStack_4f8 * fStack_4f8;
    auVar40._12_4_ = fStack_4f4 * fStack_4f4;
    auVar40._16_4_ = fStack_4f0 * fStack_4f0;
    auVar40._20_4_ = fStack_4ec * fStack_4ec;
    auVar40._24_4_ = fStack_4e8 * fStack_4e8;
    auVar40._28_4_ = fVar364;
    auVar28 = vsubps_avx(auVar321,auVar40);
    auVar134 = vsqrtps_avx(auVar110);
    fVar316 = (auVar134._0_4_ + auVar216._0_4_) * 1.0000002;
    fVar378 = (auVar134._4_4_ + auVar216._4_4_) * 1.0000002;
    fVar146 = (auVar134._8_4_ + auVar216._8_4_) * 1.0000002;
    fVar151 = (auVar134._12_4_ + auVar216._12_4_) * 1.0000002;
    fVar153 = (auVar134._16_4_ + auVar216._16_4_) * 1.0000002;
    fVar156 = (auVar134._20_4_ + auVar216._20_4_) * 1.0000002;
    fVar157 = (auVar134._24_4_ + auVar216._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar378 * fVar378;
    auVar41._0_4_ = fVar316 * fVar316;
    auVar41._8_4_ = fVar146 * fVar146;
    auVar41._12_4_ = fVar151 * fVar151;
    auVar41._16_4_ = fVar153 * fVar153;
    auVar41._20_4_ = fVar156 * fVar156;
    auVar41._24_4_ = fVar157 * fVar157;
    auVar41._28_4_ = auVar134._28_4_ + auVar216._28_4_;
    local_380._0_4_ = auVar25._0_4_ + auVar25._0_4_;
    local_380._4_4_ = auVar25._4_4_ + auVar25._4_4_;
    local_380._8_4_ = auVar25._8_4_ + auVar25._8_4_;
    local_380._12_4_ = auVar25._12_4_ + auVar25._12_4_;
    local_380._16_4_ = auVar25._16_4_ + auVar25._16_4_;
    local_380._20_4_ = auVar25._20_4_ + auVar25._20_4_;
    local_380._24_4_ = auVar25._24_4_ + auVar25._24_4_;
    fVar316 = auVar25._28_4_;
    local_380._28_4_ = fVar316 + fVar316;
    auVar216 = vsubps_avx(auVar28,auVar41);
    auVar42._4_4_ = fStack_4dc * fStack_4dc;
    auVar42._0_4_ = local_4e0 * local_4e0;
    auVar42._8_4_ = fStack_4d8 * fStack_4d8;
    auVar42._12_4_ = fStack_4d4 * fStack_4d4;
    auVar42._16_4_ = fStack_4d0 * fStack_4d0;
    auVar42._20_4_ = fStack_4cc * fStack_4cc;
    auVar42._24_4_ = fStack_4c8 * fStack_4c8;
    auVar42._28_4_ = fVar316;
    auVar324 = ZEXT3264(local_240);
    auVar25 = vsubps_avx(local_240,auVar42);
    auVar43._4_4_ = local_380._4_4_ * local_380._4_4_;
    auVar43._0_4_ = local_380._0_4_ * local_380._0_4_;
    auVar43._8_4_ = local_380._8_4_ * local_380._8_4_;
    auVar43._12_4_ = local_380._12_4_ * local_380._12_4_;
    auVar43._16_4_ = local_380._16_4_ * local_380._16_4_;
    auVar43._20_4_ = local_380._20_4_ * local_380._20_4_;
    auVar43._24_4_ = local_380._24_4_ * local_380._24_4_;
    auVar43._28_4_ = 0x3f800002;
    fVar316 = auVar25._0_4_;
    fVar378 = auVar25._4_4_;
    fVar146 = auVar25._8_4_;
    fVar151 = auVar25._12_4_;
    fVar153 = auVar25._16_4_;
    fVar156 = auVar25._20_4_;
    fVar157 = auVar25._24_4_;
    auVar44._4_4_ = auVar216._4_4_ * fVar378 * 4.0;
    auVar44._0_4_ = auVar216._0_4_ * fVar316 * 4.0;
    auVar44._8_4_ = auVar216._8_4_ * fVar146 * 4.0;
    auVar44._12_4_ = auVar216._12_4_ * fVar151 * 4.0;
    auVar44._16_4_ = auVar216._16_4_ * fVar153 * 4.0;
    auVar44._20_4_ = auVar216._20_4_ * fVar156 * 4.0;
    auVar44._24_4_ = auVar216._24_4_ * fVar157 * 4.0;
    auVar44._28_4_ = 0x40800000;
    auVar196 = vsubps_avx(auVar43,auVar44);
    auVar110 = vcmpps_avx(auVar196,auVar283,5);
    auVar276._8_4_ = 0x7fffffff;
    auVar276._0_8_ = 0x7fffffff7fffffff;
    auVar276._12_4_ = 0x7fffffff;
    auVar276._16_4_ = 0x7fffffff;
    auVar276._20_4_ = 0x7fffffff;
    auVar276._24_4_ = 0x7fffffff;
    auVar276._28_4_ = 0x7fffffff;
    local_2a0 = vandps_avx(auVar42,auVar276);
    local_2e0._0_4_ = fVar316 + fVar316;
    local_2e0._4_4_ = fVar378 + fVar378;
    local_2e0._8_4_ = fVar146 + fVar146;
    local_2e0._12_4_ = fVar151 + fVar151;
    local_2e0._16_4_ = fVar153 + fVar153;
    local_2e0._20_4_ = fVar156 + fVar156;
    local_2e0._24_4_ = fVar157 + fVar157;
    local_2e0._28_4_ = auVar25._28_4_ + auVar25._28_4_;
    local_a20 = vandps_avx(auVar25,auVar276);
    uVar84 = CONCAT44(local_380._4_4_,local_380._0_4_);
    local_2c0._0_8_ = uVar84 ^ 0x8000000080000000;
    local_2c0._8_4_ = -local_380._8_4_;
    local_2c0._12_4_ = -local_380._12_4_;
    local_2c0._16_4_ = -local_380._16_4_;
    local_2c0._20_4_ = -local_380._20_4_;
    local_2c0._24_4_ = -local_380._24_4_;
    local_2c0._28_4_ = -local_380._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar194._8_4_ = 0x7f800000;
      auVar194._0_8_ = 0x7f8000007f800000;
      auVar194._12_4_ = 0x7f800000;
      auVar194._16_4_ = 0x7f800000;
      auVar194._20_4_ = 0x7f800000;
      auVar194._24_4_ = 0x7f800000;
      auVar194._28_4_ = 0x7f800000;
      auVar132._8_4_ = 0xff800000;
      auVar132._0_8_ = 0xff800000ff800000;
      auVar132._12_4_ = 0xff800000;
      auVar132._16_4_ = 0xff800000;
      auVar132._20_4_ = 0xff800000;
      auVar132._24_4_ = 0xff800000;
      auVar132._28_4_ = 0xff800000;
    }
    else {
      auVar23 = vsqrtps_avx(auVar196);
      auVar195 = vrcpps_avx(local_2e0);
      auVar25 = vcmpps_avx(auVar196,auVar283,5);
      fVar119 = auVar195._0_4_;
      fVar144 = auVar195._4_4_;
      auVar45._4_4_ = local_2e0._4_4_ * fVar144;
      auVar45._0_4_ = local_2e0._0_4_ * fVar119;
      fVar147 = auVar195._8_4_;
      auVar45._8_4_ = local_2e0._8_4_ * fVar147;
      fVar152 = auVar195._12_4_;
      auVar45._12_4_ = local_2e0._12_4_ * fVar152;
      fVar154 = auVar195._16_4_;
      auVar45._16_4_ = local_2e0._16_4_ * fVar154;
      fVar225 = auVar195._20_4_;
      auVar45._20_4_ = local_2e0._20_4_ * fVar225;
      fVar158 = auVar195._24_4_;
      auVar45._24_4_ = local_2e0._24_4_ * fVar158;
      auVar45._28_4_ = auVar196._28_4_;
      auVar284._8_4_ = 0x3f800000;
      auVar284._0_8_ = 0x3f8000003f800000;
      auVar284._12_4_ = 0x3f800000;
      auVar284._16_4_ = 0x3f800000;
      auVar284._20_4_ = 0x3f800000;
      auVar284._24_4_ = 0x3f800000;
      auVar284._28_4_ = 0x3f800000;
      auVar196 = vsubps_avx(auVar284,auVar45);
      fVar119 = fVar119 + fVar119 * auVar196._0_4_;
      fVar144 = fVar144 + fVar144 * auVar196._4_4_;
      fVar147 = fVar147 + fVar147 * auVar196._8_4_;
      fVar152 = fVar152 + fVar152 * auVar196._12_4_;
      fVar154 = fVar154 + fVar154 * auVar196._16_4_;
      fVar225 = fVar225 + fVar225 * auVar196._20_4_;
      fVar158 = fVar158 + fVar158 * auVar196._24_4_;
      auVar283 = vsubps_avx(local_2c0,auVar23);
      fVar248 = auVar283._0_4_ * fVar119;
      fVar256 = auVar283._4_4_ * fVar144;
      auVar46._4_4_ = fVar256;
      auVar46._0_4_ = fVar248;
      fVar259 = auVar283._8_4_ * fVar147;
      auVar46._8_4_ = fVar259;
      fVar262 = auVar283._12_4_ * fVar152;
      auVar46._12_4_ = fVar262;
      fVar264 = auVar283._16_4_ * fVar154;
      auVar46._16_4_ = fVar264;
      fVar266 = auVar283._20_4_ * fVar225;
      auVar46._20_4_ = fVar266;
      fVar268 = auVar283._24_4_ * fVar158;
      auVar46._24_4_ = fVar268;
      auVar46._28_4_ = auVar283._28_4_;
      auVar283 = vsubps_avx(auVar23,local_380);
      fVar119 = auVar283._0_4_ * fVar119;
      fVar144 = auVar283._4_4_ * fVar144;
      auVar47._4_4_ = fVar144;
      auVar47._0_4_ = fVar119;
      fVar147 = auVar283._8_4_ * fVar147;
      auVar47._8_4_ = fVar147;
      fVar152 = auVar283._12_4_ * fVar152;
      auVar47._12_4_ = fVar152;
      fVar154 = auVar283._16_4_ * fVar154;
      auVar47._16_4_ = fVar154;
      fVar225 = auVar283._20_4_ * fVar225;
      auVar47._20_4_ = fVar225;
      fVar158 = auVar283._24_4_ * fVar158;
      auVar47._24_4_ = fVar158;
      auVar47._28_4_ = auVar195._28_4_ + auVar196._28_4_;
      local_340 = fVar249 * (local_500 + local_4e0 * fVar248);
      fStack_33c = fVar257 * (fStack_4fc + fStack_4dc * fVar256);
      fStack_338 = fVar260 * (fStack_4f8 + fStack_4d8 * fVar259);
      fStack_334 = fVar263 * (fStack_4f4 + fStack_4d4 * fVar262);
      fStack_330 = fVar265 * (fStack_4f0 + fStack_4d0 * fVar264);
      fStack_32c = fVar267 * (fStack_4ec + fStack_4cc * fVar266);
      fStack_328 = fVar269 * (fStack_4e8 + fStack_4c8 * fVar268);
      fStack_324 = local_2e0._28_4_;
      local_320 = fVar249 * (local_500 + local_4e0 * fVar119);
      fStack_31c = fVar257 * (fStack_4fc + fStack_4dc * fVar144);
      fStack_318 = fVar260 * (fStack_4f8 + fStack_4d8 * fVar147);
      fStack_314 = fVar263 * (fStack_4f4 + fStack_4d4 * fVar152);
      fStack_310 = fVar265 * (fStack_4f0 + fStack_4d0 * fVar154);
      fStack_30c = fVar267 * (fStack_4ec + fStack_4cc * fVar225);
      fStack_308 = fVar269 * (fStack_4e8 + fStack_4c8 * fVar158);
      fStack_304 = local_2e0._28_4_;
      auVar233._8_4_ = 0x7f800000;
      auVar233._0_8_ = 0x7f8000007f800000;
      auVar233._12_4_ = 0x7f800000;
      auVar233._16_4_ = 0x7f800000;
      auVar233._20_4_ = 0x7f800000;
      auVar233._24_4_ = 0x7f800000;
      auVar233._28_4_ = 0x7f800000;
      auVar194 = vblendvps_avx(auVar233,auVar46,auVar25);
      auVar234._8_4_ = 0xff800000;
      auVar234._0_8_ = 0xff800000ff800000;
      auVar234._12_4_ = 0xff800000;
      auVar234._16_4_ = 0xff800000;
      auVar234._20_4_ = 0xff800000;
      auVar234._24_4_ = 0xff800000;
      auVar234._28_4_ = 0xff800000;
      auVar132 = vblendvps_avx(auVar234,auVar47,auVar25);
      auVar196 = vmaxps_avx(local_4c0,local_2a0);
      auVar48._4_4_ = auVar196._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar196._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar196._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar196._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar196._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar196._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar196._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar196._28_4_;
      auVar196 = vcmpps_avx(local_a20,auVar48,1);
      auVar324 = ZEXT3264(auVar196);
      auVar283 = auVar25 & auVar196;
      if ((((((((auVar283 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar283 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar283 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar283 >> 0x7f,0) != '\0') ||
            (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar283 >> 0xbf,0) != '\0') ||
          (auVar283 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar283[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar196,auVar25);
        auVar185 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar196 = vcmpps_avx(auVar216,_DAT_01f7b000,2);
        auVar222._8_4_ = 0xff800000;
        auVar222._0_8_ = 0xff800000ff800000;
        auVar222._12_4_ = 0xff800000;
        auVar222._16_4_ = 0xff800000;
        auVar222._20_4_ = 0xff800000;
        auVar222._24_4_ = 0xff800000;
        auVar222._28_4_ = 0xff800000;
        auVar341._8_4_ = 0x7f800000;
        auVar341._0_8_ = 0x7f8000007f800000;
        auVar341._12_4_ = 0x7f800000;
        auVar341._16_4_ = 0x7f800000;
        auVar341._20_4_ = 0x7f800000;
        auVar341._24_4_ = 0x7f800000;
        auVar341._28_4_ = 0x7f800000;
        auVar216 = vblendvps_avx(auVar341,auVar222,auVar196);
        auVar206 = vpmovsxwd_avx(auVar185);
        auVar324 = ZEXT1664(auVar206);
        auVar185 = vpunpckhwd_avx(auVar185,auVar185);
        auVar240._16_16_ = auVar185;
        auVar240._0_16_ = auVar206;
        auVar194 = vblendvps_avx(auVar194,auVar216,auVar240);
        auVar216 = vblendvps_avx(auVar222,auVar341,auVar196);
        auVar132 = vblendvps_avx(auVar132,auVar216,auVar240);
        auVar200._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
        auVar200._8_4_ = auVar110._8_4_ ^ 0xffffffff;
        auVar200._12_4_ = auVar110._12_4_ ^ 0xffffffff;
        auVar200._16_4_ = auVar110._16_4_ ^ 0xffffffff;
        auVar200._20_4_ = auVar110._20_4_ ^ 0xffffffff;
        auVar200._24_4_ = auVar110._24_4_ ^ 0xffffffff;
        auVar200._28_4_ = auVar110._28_4_ ^ 0xffffffff;
        auVar110 = vorps_avx(auVar196,auVar200);
        auVar110 = vandps_avx(auVar25,auVar110);
      }
    }
    auVar355 = ZEXT3264(_local_940);
    auVar342 = ZEXT3264(_local_920);
    auVar216 = local_300 & auVar110;
    auVar288 = ZEXT3264(CONCAT428(fStack_5a4,
                                  CONCAT424(fStack_5a8,
                                            CONCAT420(fStack_5ac,
                                                      CONCAT416(fStack_5b0,
                                                                CONCAT412(fStack_5b4,
                                                                          CONCAT48(fStack_5b8,
                                                                                   CONCAT44(
                                                  fStack_5bc,local_5c0))))))));
    if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar216 >> 0x7f,0) == '\0') &&
          (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar216 >> 0xbf,0) == '\0') &&
        (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar216[0x1f])
    {
      auVar201 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar372 = ZEXT3264(_local_8a0);
    }
    else {
      fStack_4c4 = auVar24._28_4_ + fVar364 + fStack_5e4;
      auVar185 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_7c0._0_4_));
      auVar185 = vshufps_avx(auVar185,auVar185,0);
      auVar235._16_16_ = auVar185;
      auVar235._0_16_ = auVar185;
      auVar196 = vmaxps_avx(auVar235,auVar194);
      auVar185 = ZEXT416((uint)(ray->tfar - (float)local_7c0._0_4_));
      auVar185 = vshufps_avx(auVar185,auVar185,0);
      auVar236._16_16_ = auVar185;
      auVar236._0_16_ = auVar185;
      auVar283 = vminps_avx(auVar236,auVar132);
      fVar225 = auVar110._28_4_ + auVar185._12_4_;
      auVar111._0_4_ =
           local_5e0 * fVar336 + local_5c0 * (float)local_a40._0_4_ + local_600 * fVar317;
      auVar111._4_4_ = fStack_5dc * fVar343 + fStack_5bc * local_a40._4_4_ + fStack_5fc * fVar326;
      auVar111._8_4_ = fStack_5d8 * fVar344 + fStack_5b8 * local_a40._8_4_ + fStack_5f8 * fVar328;
      auVar111._12_4_ = fStack_5d4 * fVar345 + fStack_5b4 * local_a40._12_4_ + fStack_5f4 * fVar330;
      auVar111._16_4_ = fStack_5d0 * fVar346 + fStack_5b0 * local_a40._16_4_ + fStack_5f0 * fVar331;
      auVar111._20_4_ = fStack_5cc * fVar347 + fStack_5ac * local_a40._20_4_ + fStack_5ec * fVar332;
      auVar111._24_4_ = fStack_5c8 * fVar348 + fStack_5a8 * local_a40._24_4_ + fStack_5e8 * fVar333;
      auVar111._28_4_ = fVar225 + fVar225 + fVar335;
      auVar216 = vrcpps_avx(auVar111);
      fVar364 = auVar216._0_4_;
      fVar335 = auVar216._4_4_;
      auVar49._4_4_ = auVar111._4_4_ * fVar335;
      auVar49._0_4_ = auVar111._0_4_ * fVar364;
      fVar119 = auVar216._8_4_;
      auVar49._8_4_ = auVar111._8_4_ * fVar119;
      fVar144 = auVar216._12_4_;
      auVar49._12_4_ = auVar111._12_4_ * fVar144;
      fVar147 = auVar216._16_4_;
      auVar49._16_4_ = auVar111._16_4_ * fVar147;
      fVar152 = auVar216._20_4_;
      auVar49._20_4_ = auVar111._20_4_ * fVar152;
      fVar154 = auVar216._24_4_;
      auVar49._24_4_ = auVar111._24_4_ * fVar154;
      auVar49._28_4_ = uStack_1c4;
      auVar369._8_4_ = 0x3f800000;
      auVar369._0_8_ = 0x3f8000003f800000;
      auVar369._12_4_ = 0x3f800000;
      auVar369._16_4_ = 0x3f800000;
      auVar369._20_4_ = 0x3f800000;
      auVar369._24_4_ = 0x3f800000;
      auVar369._28_4_ = 0x3f800000;
      auVar25 = vsubps_avx(auVar369,auVar49);
      auVar285._8_4_ = 0x7fffffff;
      auVar285._0_8_ = 0x7fffffff7fffffff;
      auVar285._12_4_ = 0x7fffffff;
      auVar285._16_4_ = 0x7fffffff;
      auVar285._20_4_ = 0x7fffffff;
      auVar285._24_4_ = 0x7fffffff;
      auVar285._28_4_ = 0x7fffffff;
      auVar288 = ZEXT3264(auVar285);
      auVar216 = vandps_avx(auVar285,auVar111);
      auVar398._8_4_ = 0x219392ef;
      auVar398._0_8_ = 0x219392ef219392ef;
      auVar398._12_4_ = 0x219392ef;
      auVar398._16_4_ = 0x219392ef;
      auVar398._20_4_ = 0x219392ef;
      auVar398._24_4_ = 0x219392ef;
      auVar398._28_4_ = 0x219392ef;
      auVar216 = vcmpps_avx(auVar216,auVar398,1);
      auVar50._4_4_ =
           (fVar335 + fVar335 * auVar25._4_4_) *
           -(fVar343 * fVar279 + local_a40._4_4_ * fVar278 + fVar384 * fVar326);
      auVar50._0_4_ =
           (fVar364 + fVar364 * auVar25._0_4_) *
           -(fVar336 * fVar155 + (float)local_a40._0_4_ * fVar327 + fVar380 * fVar317);
      auVar50._8_4_ =
           (fVar119 + fVar119 * auVar25._8_4_) *
           -(fVar344 * fVar261 + local_a40._8_4_ * fVar258 + fVar386 * fVar328);
      auVar50._12_4_ =
           (fVar144 + fVar144 * auVar25._12_4_) *
           -(fVar345 * fVar244 + local_a40._12_4_ * fVar243 + fVar389 * fVar330);
      auVar50._16_4_ =
           (fVar147 + fVar147 * auVar25._16_4_) *
           -(fVar346 * fVar299 + local_a40._16_4_ * fVar296 + fVar391 * fVar331);
      auVar50._20_4_ =
           (fVar152 + fVar152 * auVar25._20_4_) *
           -(fVar347 * fVar334 + local_a40._20_4_ * fVar311 + fVar394 * fVar332);
      auVar50._24_4_ =
           (fVar154 + fVar154 * auVar25._24_4_) *
           -(fVar348 * fVar360 + local_a40._24_4_ * fVar358 + fVar396 * fVar333);
      auVar50._28_4_ = -(auVar27._28_4_ + fVar225);
      auVar195 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar25 = vcmpps_avx(auVar111,auVar195,1);
      auVar27 = vorps_avx(auVar216,auVar25);
      auVar25 = vcmpps_avx(auVar111,auVar195,6);
      auVar25 = vorps_avx(auVar216,auVar25);
      auVar354._8_4_ = 0xff800000;
      auVar354._0_8_ = 0xff800000ff800000;
      auVar354._12_4_ = 0xff800000;
      auVar354._16_4_ = 0xff800000;
      auVar354._20_4_ = 0xff800000;
      auVar354._24_4_ = 0xff800000;
      auVar354._28_4_ = 0xff800000;
      auVar216 = vblendvps_avx(auVar50,auVar354,auVar27);
      auVar382._8_4_ = 0x7f800000;
      auVar382._0_8_ = 0x7f8000007f800000;
      auVar382._12_4_ = 0x7f800000;
      auVar382._16_4_ = 0x7f800000;
      auVar382._20_4_ = 0x7f800000;
      auVar382._24_4_ = 0x7f800000;
      auVar382._28_4_ = 0x7f800000;
      auVar25 = vblendvps_avx(auVar50,auVar382,auVar25);
      auVar27 = vmaxps_avx(auVar196,auVar216);
      auVar25 = vminps_avx(auVar283,auVar25);
      auVar196 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar216 = vsubps_avx(auVar196,auVar197);
      auVar197 = vsubps_avx(auVar196,auVar21);
      auVar51._4_4_ = auVar197._4_4_ * -fVar383;
      auVar51._0_4_ = auVar197._0_4_ * -fVar379;
      auVar51._8_4_ = auVar197._8_4_ * -fVar385;
      auVar51._12_4_ = auVar197._12_4_ * -fVar388;
      auVar51._16_4_ = auVar197._16_4_ * -fVar390;
      auVar51._20_4_ = auVar197._20_4_ * -fVar393;
      auVar51._24_4_ = auVar197._24_4_ * -fVar395;
      auVar51._28_4_ = auVar197._28_4_;
      auVar52._4_4_ = fVar368 * auVar216._4_4_;
      auVar52._0_4_ = fVar366 * auVar216._0_4_;
      auVar52._8_4_ = fVar373 * auVar216._8_4_;
      auVar52._12_4_ = fVar374 * auVar216._12_4_;
      auVar52._16_4_ = fVar375 * auVar216._16_4_;
      auVar52._20_4_ = fVar376 * auVar216._20_4_;
      auVar52._24_4_ = fVar377 * auVar216._24_4_;
      auVar52._28_4_ = auVar216._28_4_;
      auVar216 = vsubps_avx(auVar51,auVar52);
      auVar197 = vsubps_avx(auVar196,auVar22);
      auVar53._4_4_ = fVar357 * auVar197._4_4_;
      auVar53._0_4_ = fVar351 * auVar197._0_4_;
      auVar53._8_4_ = fVar359 * auVar197._8_4_;
      auVar53._12_4_ = fVar361 * auVar197._12_4_;
      auVar53._16_4_ = fVar363 * auVar197._16_4_;
      auVar53._20_4_ = fVar365 * auVar197._20_4_;
      uVar7 = auVar197._28_4_;
      auVar53._24_4_ = fVar367 * auVar197._24_4_;
      auVar53._28_4_ = uVar7;
      auVar21 = vsubps_avx(auVar216,auVar53);
      auVar54._4_4_ = fStack_5fc * -fVar383;
      auVar54._0_4_ = local_600 * -fVar379;
      auVar54._8_4_ = fStack_5f8 * -fVar385;
      auVar54._12_4_ = fStack_5f4 * -fVar388;
      auVar54._16_4_ = fStack_5f0 * -fVar390;
      auVar54._20_4_ = fStack_5ec * -fVar393;
      auVar54._24_4_ = fStack_5e8 * -fVar395;
      auVar54._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar324 = ZEXT864(0) << 0x20;
      auVar55._4_4_ = fStack_5bc * fVar368;
      auVar55._0_4_ = local_5c0 * fVar366;
      auVar55._8_4_ = fStack_5b8 * fVar373;
      auVar55._12_4_ = fStack_5b4 * fVar374;
      auVar55._16_4_ = fStack_5b0 * fVar375;
      auVar55._20_4_ = fStack_5ac * fVar376;
      auVar55._24_4_ = fStack_5a8 * fVar377;
      auVar55._28_4_ = uVar7;
      auVar370._8_4_ = 0x3f800000;
      auVar370._0_8_ = 0x3f8000003f800000;
      auVar370._12_4_ = 0x3f800000;
      auVar370._16_4_ = 0x3f800000;
      auVar370._20_4_ = 0x3f800000;
      auVar370._24_4_ = 0x3f800000;
      auVar370._28_4_ = 0x3f800000;
      auVar216 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fStack_5dc * fVar357;
      auVar56._0_4_ = local_5e0 * fVar351;
      auVar56._8_4_ = fStack_5d8 * fVar359;
      auVar56._12_4_ = fStack_5d4 * fVar361;
      auVar56._16_4_ = fStack_5d0 * fVar363;
      auVar56._20_4_ = fStack_5cc * fVar365;
      auVar56._24_4_ = fStack_5c8 * fVar367;
      auVar56._28_4_ = uVar7;
      auVar196 = vsubps_avx(auVar216,auVar56);
      auVar216 = vrcpps_avx(auVar196);
      fVar327 = auVar216._0_4_;
      fVar155 = auVar216._4_4_;
      auVar57._4_4_ = auVar196._4_4_ * fVar155;
      auVar57._0_4_ = auVar196._0_4_ * fVar327;
      fVar278 = auVar216._8_4_;
      auVar57._8_4_ = auVar196._8_4_ * fVar278;
      fVar279 = auVar216._12_4_;
      auVar57._12_4_ = auVar196._12_4_ * fVar279;
      fVar258 = auVar216._16_4_;
      auVar57._16_4_ = auVar196._16_4_ * fVar258;
      fVar261 = auVar216._20_4_;
      auVar57._20_4_ = auVar196._20_4_ * fVar261;
      fVar243 = auVar216._24_4_;
      auVar57._24_4_ = auVar196._24_4_ * fVar243;
      auVar57._28_4_ = local_9e0._28_4_;
      auVar283 = vsubps_avx(auVar370,auVar57);
      auVar216 = vandps_avx(auVar285,auVar196);
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar112._16_4_ = 0x219392ef;
      auVar112._20_4_ = 0x219392ef;
      auVar112._24_4_ = 0x219392ef;
      auVar112._28_4_ = 0x219392ef;
      auVar197 = vcmpps_avx(auVar216,auVar112,1);
      auVar58._4_4_ = (fVar155 + fVar155 * auVar283._4_4_) * -auVar21._4_4_;
      auVar58._0_4_ = (fVar327 + fVar327 * auVar283._0_4_) * -auVar21._0_4_;
      auVar58._8_4_ = (fVar278 + fVar278 * auVar283._8_4_) * -auVar21._8_4_;
      auVar58._12_4_ = (fVar279 + fVar279 * auVar283._12_4_) * -auVar21._12_4_;
      auVar58._16_4_ = (fVar258 + fVar258 * auVar283._16_4_) * -auVar21._16_4_;
      auVar58._20_4_ = (fVar261 + fVar261 * auVar283._20_4_) * -auVar21._20_4_;
      auVar58._24_4_ = (fVar243 + fVar243 * auVar283._24_4_) * -auVar21._24_4_;
      auVar58._28_4_ = auVar21._28_4_ ^ 0x80000000;
      auVar216 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,1);
      auVar216 = vorps_avx(auVar197,auVar216);
      auVar216 = vblendvps_avx(auVar58,auVar354,auVar216);
      local_7a0 = vmaxps_avx(auVar27,auVar216);
      auVar216 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,6);
      auVar216 = vorps_avx(auVar197,auVar216);
      auVar216 = vblendvps_avx(auVar58,auVar382,auVar216);
      auVar110 = vandps_avx(local_300,auVar110);
      local_560 = vminps_avx(auVar25,auVar216);
      auVar216 = vcmpps_avx(local_7a0,local_560,2);
      auVar197 = auVar110 & auVar216;
      if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar197 >> 0x7f,0) != '\0') ||
            (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar197 >> 0xbf,0) != '\0') ||
          (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar197[0x1f] < '\0') {
        auVar197 = vminps_avx(local_700,auVar131);
        auVar21 = vminps_avx(local_720,auVar26);
        auVar197 = vminps_avx(auVar197,auVar21);
        auVar134 = vsubps_avx(auVar197,auVar134);
        _local_9c0 = vandps_avx(auVar216,auVar110);
        auVar79._4_4_ = fStack_33c;
        auVar79._0_4_ = local_340;
        auVar79._8_4_ = fStack_338;
        auVar79._12_4_ = fStack_334;
        auVar79._16_4_ = fStack_330;
        auVar79._20_4_ = fStack_32c;
        auVar79._24_4_ = fStack_328;
        auVar79._28_4_ = fStack_324;
        auVar110 = vminps_avx(auVar79,auVar370);
        auVar197 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar110 = vmaxps_avx(auVar110,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar387 + fVar118 * (auVar110._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar392 + fVar142 * (auVar110._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar397 + fVar145 * (auVar110._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_ac4 + fVar149 * (auVar110._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar387 + fVar118 * (auVar110._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar392 + fVar142 * (auVar110._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar397 + fVar145 * (auVar110._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_ac4 + auVar110._28_4_ + 7.0;
        auVar80._4_4_ = fStack_31c;
        auVar80._0_4_ = local_320;
        auVar80._8_4_ = fStack_318;
        auVar80._12_4_ = fStack_314;
        auVar80._16_4_ = fStack_310;
        auVar80._20_4_ = fStack_30c;
        auVar80._24_4_ = fStack_308;
        auVar80._28_4_ = fStack_304;
        auVar110 = vminps_avx(auVar80,auVar370);
        auVar110 = vmaxps_avx(auVar110,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar387 + fVar118 * (auVar110._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar392 + fVar142 * (auVar110._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar397 + fVar145 * (auVar110._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_ac4 + fVar149 * (auVar110._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar387 + fVar118 * (auVar110._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar392 + fVar142 * (auVar110._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar397 + fVar145 * (auVar110._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_ac4 + auVar110._28_4_ + 7.0;
        auVar59._4_4_ = auVar134._4_4_ * 0.99999976;
        auVar59._0_4_ = auVar134._0_4_ * 0.99999976;
        auVar59._8_4_ = auVar134._8_4_ * 0.99999976;
        auVar59._12_4_ = auVar134._12_4_ * 0.99999976;
        auVar59._16_4_ = auVar134._16_4_ * 0.99999976;
        auVar59._20_4_ = auVar134._20_4_ * 0.99999976;
        auVar59._24_4_ = auVar134._24_4_ * 0.99999976;
        auVar59._28_4_ = 0x3f7ffffc;
        auVar110 = vmaxps_avx(ZEXT832(0) << 0x20,auVar59);
        auVar60._4_4_ = auVar110._4_4_ * auVar110._4_4_;
        auVar60._0_4_ = auVar110._0_4_ * auVar110._0_4_;
        auVar60._8_4_ = auVar110._8_4_ * auVar110._8_4_;
        auVar60._12_4_ = auVar110._12_4_ * auVar110._12_4_;
        auVar60._16_4_ = auVar110._16_4_ * auVar110._16_4_;
        auVar60._20_4_ = auVar110._20_4_ * auVar110._20_4_;
        auVar60._24_4_ = auVar110._24_4_ * auVar110._24_4_;
        auVar60._28_4_ = auVar110._28_4_;
        local_900 = vsubps_avx(auVar28,auVar60);
        auVar61._4_4_ = local_900._4_4_ * fVar378 * 4.0;
        auVar61._0_4_ = local_900._0_4_ * fVar316 * 4.0;
        auVar61._8_4_ = local_900._8_4_ * fVar146 * 4.0;
        auVar61._12_4_ = local_900._12_4_ * fVar151 * 4.0;
        auVar61._16_4_ = local_900._16_4_ * fVar153 * 4.0;
        auVar61._20_4_ = local_900._20_4_ * fVar156 * 4.0;
        auVar61._24_4_ = local_900._24_4_ * fVar157 * 4.0;
        auVar61._28_4_ = auVar110._28_4_;
        auVar216 = vsubps_avx(auVar43,auVar61);
        auVar110 = vcmpps_avx(auVar216,ZEXT832(0) << 0x20,5);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
          auVar275 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar253 = ZEXT828(0) << 0x20;
          auVar215 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar232 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar294 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar322._8_4_ = 0xff800000;
          auVar322._0_8_ = 0xff800000ff800000;
          auVar322._12_4_ = 0xff800000;
          auVar322._16_4_ = 0xff800000;
          auVar322._20_4_ = 0xff800000;
          auVar322._24_4_ = 0xff800000;
          auVar322._28_4_ = 0xff800000;
          local_900 = auVar22;
        }
        else {
          auVar134 = vrcpps_avx(local_2e0);
          fVar316 = auVar134._0_4_;
          fVar327 = auVar134._4_4_;
          auVar62._4_4_ = local_2e0._4_4_ * fVar327;
          auVar62._0_4_ = local_2e0._0_4_ * fVar316;
          fVar155 = auVar134._8_4_;
          auVar62._8_4_ = local_2e0._8_4_ * fVar155;
          fVar278 = auVar134._12_4_;
          auVar62._12_4_ = local_2e0._12_4_ * fVar278;
          fVar279 = auVar134._16_4_;
          auVar62._16_4_ = local_2e0._16_4_ * fVar279;
          fVar258 = auVar134._20_4_;
          auVar62._20_4_ = local_2e0._20_4_ * fVar258;
          fVar261 = auVar134._24_4_;
          auVar62._24_4_ = local_2e0._24_4_ * fVar261;
          auVar62._28_4_ = local_900._28_4_;
          auVar21 = vsubps_avx(auVar370,auVar62);
          auVar197 = vsqrtps_avx(auVar216);
          fVar316 = fVar316 + fVar316 * auVar21._0_4_;
          fVar327 = fVar327 + fVar327 * auVar21._4_4_;
          fVar155 = fVar155 + fVar155 * auVar21._8_4_;
          fVar278 = fVar278 + fVar278 * auVar21._12_4_;
          fVar279 = fVar279 + fVar279 * auVar21._16_4_;
          fVar258 = fVar258 + fVar258 * auVar21._20_4_;
          fVar261 = fVar261 + fVar261 * auVar21._24_4_;
          auVar22 = vsubps_avx(local_2c0,auVar197);
          fVar360 = auVar22._0_4_ * fVar316;
          fVar364 = auVar22._4_4_ * fVar327;
          auVar63._4_4_ = fVar364;
          auVar63._0_4_ = fVar360;
          fVar387 = auVar22._8_4_ * fVar155;
          auVar63._8_4_ = fVar387;
          fVar366 = auVar22._12_4_ * fVar278;
          auVar63._12_4_ = fVar366;
          fVar392 = auVar22._16_4_ * fVar279;
          auVar63._16_4_ = fVar392;
          fVar368 = auVar22._20_4_ * fVar258;
          auVar63._20_4_ = fVar368;
          fVar397 = auVar22._24_4_ * fVar261;
          auVar63._24_4_ = fVar397;
          auVar63._28_4_ = 0x7f800000;
          auVar22 = vsubps_avx(auVar197,local_380);
          fVar316 = auVar22._0_4_ * fVar316;
          fVar327 = auVar22._4_4_ * fVar327;
          auVar64._4_4_ = fVar327;
          auVar64._0_4_ = fVar316;
          fVar155 = auVar22._8_4_ * fVar155;
          auVar64._8_4_ = fVar155;
          fVar278 = auVar22._12_4_ * fVar278;
          auVar64._12_4_ = fVar278;
          fVar279 = auVar22._16_4_ * fVar279;
          auVar64._16_4_ = fVar279;
          fVar258 = auVar22._20_4_ * fVar258;
          auVar64._20_4_ = fVar258;
          fVar261 = auVar22._24_4_ * fVar261;
          auVar64._24_4_ = fVar261;
          auVar64._28_4_ = 0x3f800000;
          fVar243 = fVar249 * (fVar360 * local_4e0 + local_500);
          fVar244 = fVar257 * (fVar364 * fStack_4dc + fStack_4fc);
          fVar296 = fVar260 * (fVar387 * fStack_4d8 + fStack_4f8);
          fVar299 = fVar263 * (fVar366 * fStack_4d4 + fStack_4f4);
          fVar311 = fVar265 * (fVar392 * fStack_4d0 + fStack_4f0);
          fVar334 = fVar267 * (fVar368 * fStack_4cc + fStack_4ec);
          fVar358 = fVar269 * (fVar397 * fStack_4c8 + fStack_4e8);
          auVar218._0_4_ = fVar290 + fVar150 * fVar243;
          auVar218._4_4_ = fVar297 + fVar270 * fVar244;
          auVar218._8_4_ = fVar300 + fVar255 * fVar296;
          auVar218._12_4_ = fVar303 + fVar242 * fVar299;
          auVar218._16_4_ = fVar306 + fVar289 * fVar311;
          auVar218._20_4_ = fVar309 + fVar308 * fVar334;
          auVar218._24_4_ = fVar312 + fVar356 * fVar358;
          auVar218._28_4_ = fVar314 + auVar22._28_4_;
          auVar65._4_4_ = fStack_5dc * fVar364;
          auVar65._0_4_ = local_5e0 * fVar360;
          auVar65._8_4_ = fStack_5d8 * fVar387;
          auVar65._12_4_ = fStack_5d4 * fVar366;
          auVar65._16_4_ = fStack_5d0 * fVar392;
          auVar65._20_4_ = fStack_5cc * fVar368;
          auVar65._24_4_ = fStack_5c8 * fVar397;
          auVar65._28_4_ = auVar197._28_4_;
          auVar22 = vsubps_avx(auVar65,auVar218);
          auVar237._0_4_ = fVar291 + fVar143 * fVar243;
          auVar237._4_4_ = fVar298 + fVar329 * fVar244;
          auVar237._8_4_ = fVar301 + fVar280 * fVar296;
          auVar237._12_4_ = fVar304 + fVar224 * fVar299;
          auVar237._16_4_ = fVar307 + fVar245 * fVar311;
          auVar237._20_4_ = fVar310 + fVar302 * fVar334;
          auVar237._24_4_ = fVar313 + fVar349 * fVar358;
          auVar237._28_4_ = fVar315 + auVar197._28_4_;
          auVar66._4_4_ = fStack_5bc * fVar364;
          auVar66._0_4_ = local_5c0 * fVar360;
          auVar66._8_4_ = fStack_5b8 * fVar387;
          auVar66._12_4_ = fStack_5b4 * fVar366;
          auVar66._16_4_ = fStack_5b0 * fVar392;
          auVar66._20_4_ = fStack_5ac * fVar368;
          auVar66._24_4_ = fStack_5a8 * fVar397;
          auVar66._28_4_ = 0x3e000000;
          local_800 = vsubps_avx(auVar66,auVar237);
          auVar198._0_4_ = fVar159 + fVar325 * fVar243;
          auVar198._4_4_ = fVar175 + fVar160 * fVar244;
          auVar198._8_4_ = fVar176 + fVar247 * fVar296;
          auVar198._12_4_ = fVar177 + fVar241 * fVar299;
          auVar198._16_4_ = fStack_7d0 + fVar246 * fVar311;
          auVar198._20_4_ = fStack_7cc + fVar305 * fVar334;
          auVar198._24_4_ = fStack_7c8 + fVar350 * fVar358;
          auVar198._28_4_ = fStack_7c4 + auVar134._28_4_ + auVar21._28_4_ + fStack_4e4;
          auVar67._4_4_ = fStack_5fc * fVar364;
          auVar67._0_4_ = local_600 * fVar360;
          auVar67._8_4_ = fStack_5f8 * fVar387;
          auVar67._12_4_ = fStack_5f4 * fVar366;
          auVar67._16_4_ = fStack_5f0 * fVar392;
          auVar67._20_4_ = fStack_5ec * fVar368;
          auVar67._24_4_ = fStack_5e8 * fVar397;
          auVar67._28_4_ = 0x3e000000;
          local_a40 = vsubps_avx(auVar67,auVar198);
          fVar249 = fVar249 * (fVar316 * local_4e0 + local_500);
          fVar257 = fVar257 * (fVar327 * fStack_4dc + fStack_4fc);
          fVar260 = fVar260 * (fVar155 * fStack_4d8 + fStack_4f8);
          fVar263 = fVar263 * (fVar278 * fStack_4d4 + fStack_4f4);
          fVar265 = fVar265 * (fVar279 * fStack_4d0 + fStack_4f0);
          fVar267 = fVar267 * (fVar258 * fStack_4cc + fStack_4ec);
          fVar269 = fVar269 * (fVar261 * fStack_4c8 + fStack_4e8);
          auVar199._0_4_ = fVar290 + fVar150 * fVar249;
          auVar199._4_4_ = fVar297 + fVar270 * fVar257;
          auVar199._8_4_ = fVar300 + fVar255 * fVar260;
          auVar199._12_4_ = fVar303 + fVar242 * fVar263;
          auVar199._16_4_ = fVar306 + fVar289 * fVar265;
          auVar199._20_4_ = fVar309 + fVar308 * fVar267;
          auVar199._24_4_ = fVar312 + fVar356 * fVar269;
          auVar199._28_4_ = fVar314 + local_a40._28_4_ + fStack_4e4;
          auVar68._4_4_ = fStack_5dc * fVar327;
          auVar68._0_4_ = local_5e0 * fVar316;
          auVar68._8_4_ = fStack_5d8 * fVar155;
          auVar68._12_4_ = fStack_5d4 * fVar278;
          auVar68._16_4_ = fStack_5d0 * fVar279;
          auVar68._20_4_ = fStack_5cc * fVar258;
          auVar68._24_4_ = fStack_5c8 * fVar261;
          auVar68._28_4_ = fVar362;
          auVar197 = vsubps_avx(auVar68,auVar199);
          auVar277._0_4_ = fVar291 + fVar143 * fVar249;
          auVar277._4_4_ = fVar298 + fVar329 * fVar257;
          auVar277._8_4_ = fVar301 + fVar280 * fVar260;
          auVar277._12_4_ = fVar304 + fVar224 * fVar263;
          auVar277._16_4_ = fVar307 + fVar245 * fVar265;
          auVar277._20_4_ = fVar310 + fVar302 * fVar267;
          auVar277._24_4_ = fVar313 + fVar349 * fVar269;
          auVar277._28_4_ = fVar315 + fVar362;
          auVar69._4_4_ = fStack_5bc * fVar327;
          auVar69._0_4_ = local_5c0 * fVar316;
          auVar69._8_4_ = fStack_5b8 * fVar155;
          auVar69._12_4_ = fStack_5b4 * fVar278;
          auVar69._16_4_ = fStack_5b0 * fVar279;
          auVar69._20_4_ = fStack_5ac * fVar258;
          auVar69._24_4_ = fStack_5a8 * fVar261;
          auVar69._28_4_ = fStack_5a4;
          auVar134 = vsubps_avx(auVar69,auVar277);
          auVar275 = auVar134._0_28_;
          auVar254._0_4_ = fVar159 + fVar325 * fVar249;
          auVar254._4_4_ = fVar175 + fVar160 * fVar257;
          auVar254._8_4_ = fVar176 + fVar247 * fVar260;
          auVar254._12_4_ = fVar177 + fVar241 * fVar263;
          auVar254._16_4_ = fStack_7d0 + fVar246 * fVar265;
          auVar254._20_4_ = fStack_7cc + fVar305 * fVar267;
          auVar254._24_4_ = fStack_7c8 + fVar350 * fVar269;
          auVar254._28_4_ = fStack_7c4 + 0.125;
          auVar70._4_4_ = fStack_5fc * fVar327;
          auVar70._0_4_ = local_600 * fVar316;
          auVar70._8_4_ = fStack_5f8 * fVar155;
          auVar70._12_4_ = fStack_5f4 * fVar278;
          auVar70._16_4_ = fStack_5f0 * fVar279;
          auVar70._20_4_ = fStack_5ec * fVar258;
          auVar70._24_4_ = fStack_5e8 * fVar261;
          auVar70._28_4_ = fStack_5a4;
          auVar134 = vsubps_avx(auVar70,auVar254);
          auVar253 = auVar134._0_28_;
          auVar216 = vcmpps_avx(auVar216,_DAT_01f7b000,5);
          auVar287._8_4_ = 0x7f800000;
          auVar287._0_8_ = 0x7f8000007f800000;
          auVar287._12_4_ = 0x7f800000;
          auVar287._16_4_ = 0x7f800000;
          auVar287._20_4_ = 0x7f800000;
          auVar287._24_4_ = 0x7f800000;
          auVar287._28_4_ = 0x7f800000;
          auVar286 = vblendvps_avx(auVar287,auVar63,auVar216);
          auVar134 = vmaxps_avx(local_4c0,local_2a0);
          auVar71._4_4_ = auVar134._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar134._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar134._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar134._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar134._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar134._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar134._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar134._28_4_;
          auVar134 = vcmpps_avx(local_a20,auVar71,1);
          auVar323._8_4_ = 0xff800000;
          auVar323._0_8_ = 0xff800000ff800000;
          auVar323._12_4_ = 0xff800000;
          auVar323._16_4_ = 0xff800000;
          auVar323._20_4_ = 0xff800000;
          auVar323._24_4_ = 0xff800000;
          auVar323._28_4_ = 0xff800000;
          auVar322 = vblendvps_avx(auVar323,auVar64,auVar216);
          auVar21 = auVar216 & auVar134;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0x7f,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0xbf,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar21[0x1f] < '\0') {
            auVar110 = vandps_avx(auVar134,auVar216);
            auVar185 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
            auVar21 = vcmpps_avx(local_900,ZEXT832(0) << 0x20,2);
            auVar141._8_4_ = 0xff800000;
            auVar141._0_8_ = 0xff800000ff800000;
            auVar141._12_4_ = 0xff800000;
            auVar141._16_4_ = 0xff800000;
            auVar141._20_4_ = 0xff800000;
            auVar141._24_4_ = 0xff800000;
            auVar141._28_4_ = 0xff800000;
            auVar223._8_4_ = 0x7f800000;
            auVar223._0_8_ = 0x7f8000007f800000;
            auVar223._12_4_ = 0x7f800000;
            auVar223._16_4_ = 0x7f800000;
            auVar223._20_4_ = 0x7f800000;
            auVar223._24_4_ = 0x7f800000;
            auVar223._28_4_ = 0x7f800000;
            auVar134 = vblendvps_avx(auVar223,auVar141,auVar21);
            auVar206 = vpmovsxwd_avx(auVar185);
            auVar185 = vpunpckhwd_avx(auVar185,auVar185);
            auVar371._16_16_ = auVar185;
            auVar371._0_16_ = auVar206;
            auVar286 = vblendvps_avx(auVar286,auVar134,auVar371);
            auVar134 = vblendvps_avx(auVar141,auVar223,auVar21);
            auVar322 = vblendvps_avx(auVar322,auVar134,auVar371);
            auVar174._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
            auVar174._8_4_ = auVar110._8_4_ ^ 0xffffffff;
            auVar174._12_4_ = auVar110._12_4_ ^ 0xffffffff;
            auVar174._16_4_ = auVar110._16_4_ ^ 0xffffffff;
            auVar174._20_4_ = auVar110._20_4_ ^ 0xffffffff;
            auVar174._24_4_ = auVar110._24_4_ ^ 0xffffffff;
            auVar174._28_4_ = auVar110._28_4_ ^ 0xffffffff;
            auVar110 = vorps_avx(auVar21,auVar174);
            auVar110 = vandps_avx(auVar216,auVar110);
          }
          auVar215 = auVar22._0_28_;
          auVar232 = local_800._0_28_;
          auVar294 = local_a40._0_28_;
        }
        fVar316 = (ray->dir).field_0.m128[0];
        fVar143 = (ray->dir).field_0.m128[1];
        fVar325 = (ray->dir).field_0.m128[2];
        local_540 = local_7a0;
        local_520 = vminps_avx(local_560,auVar286);
        _local_740 = vmaxps_avx(local_7a0,auVar322);
        auVar324 = ZEXT3264(_local_740);
        _local_580 = _local_740;
        auVar216 = vcmpps_avx(local_7a0,local_520,2);
        local_620 = vandps_avx(auVar216,_local_9c0);
        auVar288 = ZEXT3264(local_620);
        auVar216 = vcmpps_avx(_local_740,local_560,2);
        local_780 = vandps_avx(auVar216,_local_9c0);
        auVar216 = vorps_avx(local_620,local_780);
        if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar216 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar216 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar216 >> 0x7f,0) != '\0') ||
              (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar216 >> 0xbf,0) != '\0') ||
            (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar216[0x1f] < '\0') {
          fVar150 = local_780._28_4_;
          auVar114._0_4_ =
               fVar316 * auVar197._0_4_ + fVar143 * auVar275._0_4_ + fVar325 * auVar253._0_4_;
          auVar114._4_4_ =
               fVar316 * auVar197._4_4_ + fVar143 * auVar275._4_4_ + fVar325 * auVar253._4_4_;
          auVar114._8_4_ =
               fVar316 * auVar197._8_4_ + fVar143 * auVar275._8_4_ + fVar325 * auVar253._8_4_;
          auVar114._12_4_ =
               fVar316 * auVar197._12_4_ + fVar143 * auVar275._12_4_ + fVar325 * auVar253._12_4_;
          auVar114._16_4_ =
               fVar316 * auVar197._16_4_ + fVar143 * auVar275._16_4_ + fVar325 * auVar253._16_4_;
          auVar114._20_4_ =
               fVar316 * auVar197._20_4_ + fVar143 * auVar275._20_4_ + fVar325 * auVar253._20_4_;
          auVar114._24_4_ =
               fVar316 * auVar197._24_4_ + fVar143 * auVar275._24_4_ + fVar325 * auVar253._24_4_;
          auVar114._28_4_ = fVar150 + fVar150 + auVar216._28_4_;
          auVar169._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
          auVar169._8_4_ = auVar110._8_4_ ^ 0xffffffff;
          auVar169._12_4_ = auVar110._12_4_ ^ 0xffffffff;
          auVar169._16_4_ = auVar110._16_4_ ^ 0xffffffff;
          auVar169._20_4_ = auVar110._20_4_ ^ 0xffffffff;
          auVar169._24_4_ = auVar110._24_4_ ^ 0xffffffff;
          auVar169._28_4_ = auVar110._28_4_ ^ 0xffffffff;
          auVar219._8_4_ = 0x7fffffff;
          auVar219._0_8_ = 0x7fffffff7fffffff;
          auVar219._12_4_ = 0x7fffffff;
          auVar219._16_4_ = 0x7fffffff;
          auVar219._20_4_ = 0x7fffffff;
          auVar219._24_4_ = 0x7fffffff;
          auVar219._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar114,auVar219);
          auVar238._8_4_ = 0x3e99999a;
          auVar238._0_8_ = 0x3e99999a3e99999a;
          auVar238._12_4_ = 0x3e99999a;
          auVar238._16_4_ = 0x3e99999a;
          auVar238._20_4_ = 0x3e99999a;
          auVar238._24_4_ = 0x3e99999a;
          auVar238._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar238,1);
          local_660 = vorps_avx(auVar110,auVar169);
          auVar115._0_4_ =
               fVar316 * auVar215._0_4_ + fVar143 * auVar232._0_4_ + auVar294._0_4_ * fVar325;
          auVar115._4_4_ =
               fVar316 * auVar215._4_4_ + fVar143 * auVar232._4_4_ + auVar294._4_4_ * fVar325;
          auVar115._8_4_ =
               fVar316 * auVar215._8_4_ + fVar143 * auVar232._8_4_ + auVar294._8_4_ * fVar325;
          auVar115._12_4_ =
               fVar316 * auVar215._12_4_ + fVar143 * auVar232._12_4_ + auVar294._12_4_ * fVar325;
          auVar115._16_4_ =
               fVar316 * auVar215._16_4_ + fVar143 * auVar232._16_4_ + auVar294._16_4_ * fVar325;
          auVar115._20_4_ =
               fVar316 * auVar215._20_4_ + fVar143 * auVar232._20_4_ + auVar294._20_4_ * fVar325;
          auVar115._24_4_ =
               fVar316 * auVar215._24_4_ + fVar143 * auVar232._24_4_ + auVar294._24_4_ * fVar325;
          auVar115._28_4_ = fVar150 + auVar197._28_4_ + local_660._28_4_;
          auVar110 = vandps_avx(auVar115,auVar219);
          auVar110 = vcmpps_avx(auVar110,auVar238,1);
          auVar110 = vorps_avx(auVar110,auVar169);
          auVar135._8_4_ = 3;
          auVar135._0_8_ = 0x300000003;
          auVar135._12_4_ = 3;
          auVar135._16_4_ = 3;
          auVar135._20_4_ = 3;
          auVar135._24_4_ = 3;
          auVar135._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar170,auVar135,auVar110);
          local_680 = ZEXT432(local_b24);
          local_6a0 = vpshufd_avx(ZEXT416(local_b24),0);
          auVar185 = vpcmpgtd_avx(auVar110._16_16_,local_6a0);
          auStack_690 = auVar24._16_16_;
          auVar206 = vpcmpgtd_avx(auVar110._0_16_,local_6a0);
          auVar136._16_16_ = auVar185;
          auVar136._0_16_ = auVar206;
          local_640 = vblendps_avx(ZEXT1632(auVar206),auVar136,0xf0);
          auVar110 = vandnps_avx(local_640,local_620);
          local_760._4_4_ = local_7a0._4_4_ + (float)local_6e0._4_4_;
          local_760._0_4_ = local_7a0._0_4_ + (float)local_6e0._0_4_;
          fStack_758 = local_7a0._8_4_ + fStack_6d8;
          fStack_754 = local_7a0._12_4_ + fStack_6d4;
          fStack_750 = local_7a0._16_4_ + fStack_6d0;
          fStack_74c = local_7a0._20_4_ + fStack_6cc;
          fStack_748 = local_7a0._24_4_ + fStack_6c8;
          fStack_744 = local_7a0._28_4_ + fStack_6c4;
          while( true ) {
            local_3a0 = auVar110;
            local_af0 = auVar16._0_4_;
            fStack_aec = auVar16._4_4_;
            fStack_ae8 = auVar16._8_4_;
            fStack_ae4 = auVar16._12_4_;
            if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar110 >> 0x7f,0) == '\0') &&
                  (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0xbf,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar110[0x1f]) break;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar216 = vblendvps_avx(auVar137,local_7a0,auVar110);
            auVar134 = vshufps_avx(auVar216,auVar216,0xb1);
            auVar134 = vminps_avx(auVar216,auVar134);
            auVar197 = vshufpd_avx(auVar134,auVar134,5);
            auVar134 = vminps_avx(auVar134,auVar197);
            auVar197 = vperm2f128_avx(auVar134,auVar134,1);
            auVar134 = vminps_avx(auVar134,auVar197);
            auVar216 = vcmpps_avx(auVar216,auVar134,0);
            auVar134 = auVar110 & auVar216;
            if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0x7f,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0xbf,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar134[0x1f] < '\0') {
              auVar110 = vandps_avx(auVar216,auVar110);
            }
            uVar82 = vmovmskps_avx(auVar110);
            uVar90 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar84 = (ulong)uVar90;
            *(undefined4 *)(local_3a0 + uVar84 * 4) = 0;
            aVar8 = (ray->dir).field_0.field_1;
            local_7e0 = aVar8.x;
            fStack_7dc = aVar8.y;
            fStack_7d8 = aVar8.z;
            aStack_7d4 = aVar8.field_3;
            auVar185 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
            fVar316 = local_1a0[uVar84];
            uVar90 = *(uint *)(local_540 + uVar84 * 4);
            if (auVar185._0_4_ < 0.0) {
              auVar288 = ZEXT1664(auVar288._0_16_);
              fVar143 = sqrtf(auVar185._0_4_);
              uVar84 = extraout_RAX;
            }
            else {
              auVar185 = vsqrtss_avx(auVar185,auVar185);
              fVar143 = auVar185._0_4_;
            }
            auVar206 = vminps_avx(auVar16,_local_990);
            auVar185 = vmaxps_avx(auVar16,_local_990);
            auVar182 = vminps_avx(_local_980,_local_9a0);
            auVar101 = vminps_avx(auVar206,auVar182);
            auVar206 = vmaxps_avx(_local_980,_local_9a0);
            auVar182 = vmaxps_avx(auVar185,auVar206);
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar185 = vandps_avx(auVar101,auVar181);
            auVar206 = vandps_avx(auVar182,auVar181);
            auVar185 = vmaxps_avx(auVar185,auVar206);
            auVar206 = vmovshdup_avx(auVar185);
            auVar206 = vmaxss_avx(auVar206,auVar185);
            auVar185 = vshufpd_avx(auVar185,auVar185,1);
            auVar185 = vmaxss_avx(auVar185,auVar206);
            local_a20._0_4_ = auVar185._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar143 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar182,auVar182,0xff);
            auVar185 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar316),0x10);
            for (uVar88 = 0; bVar81 = (byte)uVar84, uVar88 != 5; uVar88 = uVar88 + 1) {
              auVar206 = vshufps_avx(auVar185,auVar185,0);
              auVar100._0_4_ = auVar206._0_4_ * local_7e0 + 0.0;
              auVar100._4_4_ = auVar206._4_4_ * fStack_7dc + 0.0;
              auVar100._8_4_ = auVar206._8_4_ * fStack_7d8 + 0.0;
              auVar100._12_4_ = auVar206._12_4_ * aStack_7d4.w + 0.0;
              auVar206 = vmovshdup_avx(auVar185);
              fVar329 = auVar206._0_4_;
              fVar327 = 1.0 - fVar329;
              fVar143 = fVar329 * fVar329;
              fVar325 = fVar329 * 3.0;
              fVar316 = fVar325 + -5.0;
              fVar150 = fVar327 * fVar327;
              auVar206 = ZEXT416((uint)(fVar329 * fVar329 * -fVar327 * 0.5));
              auVar206 = vshufps_avx(auVar206,auVar206,0);
              auVar182 = ZEXT416((uint)((fVar150 * (fVar327 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar182 = vshufps_avx(auVar182,auVar182,0);
              auVar101 = ZEXT416((uint)((fVar143 * fVar316 + 2.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar123 = ZEXT416((uint)(fVar327 * fVar327 * -fVar329 * 0.5));
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              auVar162._0_4_ =
                   auVar123._0_4_ * local_af0 +
                   auVar101._0_4_ * (float)local_990._0_4_ +
                   auVar182._0_4_ * (float)local_980._0_4_ + auVar206._0_4_ * (float)local_9a0._0_4_
              ;
              auVar162._4_4_ =
                   auVar123._4_4_ * fStack_aec +
                   auVar101._4_4_ * (float)local_990._4_4_ +
                   auVar182._4_4_ * (float)local_980._4_4_ + auVar206._4_4_ * (float)local_9a0._4_4_
              ;
              auVar162._8_4_ =
                   auVar123._8_4_ * fStack_ae8 +
                   auVar101._8_4_ * fStack_988 +
                   auVar182._8_4_ * fStack_978 + auVar206._8_4_ * fStack_998;
              auVar162._12_4_ =
                   auVar123._12_4_ * fStack_ae4 +
                   auVar101._12_4_ * fStack_984 +
                   auVar182._12_4_ * fStack_974 + auVar206._12_4_ * fStack_994;
              local_800._0_16_ = auVar162;
              auVar206 = vsubps_avx(auVar100,auVar162);
              _local_9c0 = auVar206;
              auVar206 = vdpps_avx(auVar206,auVar206,0x7f);
              local_a40._0_16_ = ZEXT416((uint)(fVar329 * -9.0 + 4.0));
              fVar155 = auVar206._0_4_;
              if (fVar155 < 0.0) {
                local_9e0._0_4_ = fVar143;
                local_820._0_16_ = ZEXT416((uint)fVar327);
                local_a00._0_4_ = fVar325;
                local_840._0_4_ = fVar329 * 9.0;
                local_860._0_4_ = fVar316;
                local_880._0_4_ = fVar150;
                local_700._0_4_ = fVar327 * -2.0;
                fVar160 = sqrtf(fVar155);
                uVar84 = extraout_RAX_00;
                fVar316 = (float)local_860._0_4_;
                fVar279 = (float)local_840._0_4_;
                fVar270 = (float)local_700._0_4_;
                fVar143 = (float)local_9e0._0_4_;
                fVar278 = (float)local_a00._0_4_;
                fVar150 = (float)local_880._0_4_;
                fVar327 = (float)local_820._0_4_;
              }
              else {
                auVar182 = vsqrtss_avx(auVar206,auVar206);
                fVar160 = auVar182._0_4_;
                fVar279 = fVar329 * 9.0;
                fVar270 = fVar327 * -2.0;
                fVar278 = fVar325;
              }
              auVar182 = ZEXT416((uint)((fVar143 + fVar329 * fVar270) * 0.5));
              auVar182 = vshufps_avx(auVar182,auVar182,0);
              auVar101 = ZEXT416((uint)(((fVar327 + fVar327) * (fVar278 + 2.0) +
                                        fVar327 * fVar327 * -3.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar123 = ZEXT416((uint)((fVar316 * (fVar329 + fVar329) + fVar329 * fVar278) * 0.5));
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              auVar288 = ZEXT1664(_local_990);
              auVar124 = ZEXT416((uint)((fVar329 * (fVar327 + fVar327) - fVar150) * 0.5));
              auVar124 = vshufps_avx(auVar124,auVar124,0);
              auVar340._0_4_ =
                   local_af0 * auVar124._0_4_ +
                   local_990._0_4_ * auVar123._0_4_ +
                   (float)local_9a0._0_4_ * auVar182._0_4_ + (float)local_980._0_4_ * auVar101._0_4_
              ;
              auVar340._4_4_ =
                   fStack_aec * auVar124._4_4_ +
                   local_990._4_4_ * auVar123._4_4_ +
                   (float)local_9a0._4_4_ * auVar182._4_4_ + (float)local_980._4_4_ * auVar101._4_4_
              ;
              auVar340._8_4_ =
                   fStack_ae8 * auVar124._8_4_ +
                   local_990._8_4_ * auVar123._8_4_ +
                   fStack_998 * auVar182._8_4_ + fStack_978 * auVar101._8_4_;
              auVar340._12_4_ =
                   fStack_ae4 * auVar124._12_4_ +
                   local_990._12_4_ * auVar123._12_4_ +
                   fStack_994 * auVar182._12_4_ + fStack_974 * auVar101._12_4_;
              auVar124 = vpermilps_avx(ZEXT416((uint)(fVar325 + -1.0)),0);
              auVar18 = vpermilps_avx(local_a40._0_16_,0);
              auVar182 = vshufps_avx(ZEXT416((uint)(fVar279 + -5.0)),ZEXT416((uint)(fVar279 + -5.0))
                                     ,0);
              auVar101 = ZEXT416((uint)(fVar329 * -3.0 + 2.0));
              auVar123 = vshufps_avx(auVar101,auVar101,0);
              auVar101 = vdpps_avx(auVar340,auVar340,0x7f);
              auVar125._0_4_ =
                   local_af0 * auVar123._0_4_ +
                   local_990._0_4_ * auVar182._0_4_ +
                   (float)local_980._0_4_ * auVar18._0_4_ + (float)local_9a0._0_4_ * auVar124._0_4_;
              auVar125._4_4_ =
                   fStack_aec * auVar123._4_4_ +
                   local_990._4_4_ * auVar182._4_4_ +
                   (float)local_980._4_4_ * auVar18._4_4_ + (float)local_9a0._4_4_ * auVar124._4_4_;
              auVar125._8_4_ =
                   fStack_ae8 * auVar123._8_4_ +
                   local_990._8_4_ * auVar182._8_4_ +
                   fStack_978 * auVar18._8_4_ + fStack_998 * auVar124._8_4_;
              auVar125._12_4_ =
                   fStack_ae4 * auVar123._12_4_ +
                   local_990._12_4_ * auVar182._12_4_ +
                   fStack_974 * auVar18._12_4_ + fStack_994 * auVar124._12_4_;
              auVar182 = vblendps_avx(auVar101,_DAT_01f45a50,0xe);
              auVar123 = vrsqrtss_avx(auVar182,auVar182);
              fVar143 = auVar123._0_4_;
              fVar316 = auVar101._0_4_;
              auVar123 = vdpps_avx(auVar340,auVar125,0x7f);
              auVar124 = vshufps_avx(auVar101,auVar101,0);
              auVar126._0_4_ = auVar125._0_4_ * auVar124._0_4_;
              auVar126._4_4_ = auVar125._4_4_ * auVar124._4_4_;
              auVar126._8_4_ = auVar125._8_4_ * auVar124._8_4_;
              auVar126._12_4_ = auVar125._12_4_ * auVar124._12_4_;
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              auVar207._0_4_ = auVar340._0_4_ * auVar123._0_4_;
              auVar207._4_4_ = auVar340._4_4_ * auVar123._4_4_;
              auVar207._8_4_ = auVar340._8_4_ * auVar123._8_4_;
              auVar207._12_4_ = auVar340._12_4_ * auVar123._12_4_;
              auVar18 = vsubps_avx(auVar126,auVar207);
              auVar123 = vrcpss_avx(auVar182,auVar182);
              auVar182 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                    ZEXT416((uint)(auVar185._0_4_ * (float)local_900._0_4_)));
              auVar123 = ZEXT416((uint)(auVar123._0_4_ * (2.0 - fVar316 * auVar123._0_4_)));
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              uVar72 = CONCAT44(auVar340._4_4_,auVar340._0_4_);
              auVar229._0_8_ = uVar72 ^ 0x8000000080000000;
              auVar229._8_4_ = -auVar340._8_4_;
              auVar229._12_4_ = -auVar340._12_4_;
              auVar124 = ZEXT416((uint)(fVar143 * 1.5 + fVar316 * -0.5 * fVar143 * fVar143 * fVar143
                                       ));
              auVar124 = vshufps_avx(auVar124,auVar124,0);
              auVar183._0_4_ = auVar124._0_4_ * auVar18._0_4_ * auVar123._0_4_;
              auVar183._4_4_ = auVar124._4_4_ * auVar18._4_4_ * auVar123._4_4_;
              auVar183._8_4_ = auVar124._8_4_ * auVar18._8_4_ * auVar123._8_4_;
              auVar183._12_4_ = auVar124._12_4_ * auVar18._12_4_ * auVar123._12_4_;
              auVar252._0_4_ = auVar340._0_4_ * auVar124._0_4_;
              auVar252._4_4_ = auVar340._4_4_ * auVar124._4_4_;
              auVar252._8_4_ = auVar340._8_4_ * auVar124._8_4_;
              auVar252._12_4_ = auVar340._12_4_ * auVar124._12_4_;
              local_a40._0_4_ = auVar182._0_4_;
              if (fVar316 < 0.0) {
                local_9e0._0_16_ = auVar229;
                local_820._0_16_ = auVar252;
                local_a00._0_16_ = auVar183;
                auVar288 = ZEXT1664(_local_990);
                fVar143 = sqrtf(fVar316);
                uVar84 = extraout_RAX_01;
                auVar183 = local_a00._0_16_;
                auVar229 = local_9e0._0_16_;
                auVar252 = local_820._0_16_;
                fVar316 = (float)local_a40._0_4_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar143 = auVar101._0_4_;
                fVar316 = auVar182._0_4_;
              }
              auVar182 = vdpps_avx(_local_9c0,auVar252,0x7f);
              fVar143 = ((float)local_a20._0_4_ / fVar143) * (fVar160 + 1.0) +
                        fVar316 + fVar160 * (float)local_a20._0_4_;
              auVar101 = vdpps_avx(auVar229,auVar252,0x7f);
              auVar123 = vdpps_avx(_local_9c0,auVar183,0x7f);
              auVar76._4_4_ = fStack_7dc;
              auVar76._0_4_ = local_7e0;
              auVar76._8_4_ = fStack_7d8;
              auVar76._12_4_ = aStack_7d4.a;
              auVar124 = vdpps_avx(auVar76,auVar252,0x7f);
              auVar18 = vdpps_avx(_local_9c0,auVar229,0x7f);
              fVar325 = auVar101._0_4_ + auVar123._0_4_;
              fVar150 = auVar182._0_4_;
              auVar102._0_4_ = fVar150 * fVar150;
              auVar102._4_4_ = auVar182._4_4_ * auVar182._4_4_;
              auVar102._8_4_ = auVar182._8_4_ * auVar182._8_4_;
              auVar102._12_4_ = auVar182._12_4_ * auVar182._12_4_;
              auVar123 = vsubps_avx(auVar206,auVar102);
              auVar101 = vdpps_avx(_local_9c0,auVar76,0x7f);
              fVar327 = auVar18._0_4_ - fVar150 * fVar325;
              fVar329 = auVar101._0_4_ - fVar150 * auVar124._0_4_;
              auVar101 = vrsqrtss_avx(auVar123,auVar123);
              fVar160 = auVar123._0_4_;
              fVar150 = auVar101._0_4_;
              fVar150 = fVar150 * 1.5 + fVar160 * -0.5 * fVar150 * fVar150 * fVar150;
              if (fVar160 < 0.0) {
                local_9e0._0_4_ = fVar143;
                local_820._0_16_ = auVar124;
                local_a00._0_16_ = ZEXT416((uint)fVar325);
                local_840._0_4_ = fVar327;
                local_860._0_4_ = fVar329;
                local_880._0_4_ = fVar150;
                auVar288 = ZEXT1664(auVar288._0_16_);
                fVar160 = sqrtf(fVar160);
                uVar84 = extraout_RAX_02;
                fVar143 = (float)local_9e0._0_4_;
                fVar150 = (float)local_880._0_4_;
                fVar327 = (float)local_840._0_4_;
                fVar329 = (float)local_860._0_4_;
                auVar124 = local_820._0_16_;
                fVar316 = (float)local_a40._0_4_;
                auVar101 = local_a00._0_16_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar123,auVar123);
                fVar160 = auVar101._0_4_;
                auVar101 = ZEXT416((uint)fVar325);
              }
              auVar18 = vpermilps_avx(local_800._0_16_,0xff);
              auVar19 = vshufps_avx(auVar340,auVar340,0xff);
              fVar325 = fVar327 * fVar150 - auVar19._0_4_;
              auVar208._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
              auVar208._8_4_ = auVar124._8_4_ ^ 0x80000000;
              auVar208._12_4_ = auVar124._12_4_ ^ 0x80000000;
              auVar230._0_4_ = -fVar325;
              auVar230._4_4_ = 0x80000000;
              auVar230._8_4_ = 0x80000000;
              auVar230._12_4_ = 0x80000000;
              auVar123 = vinsertps_avx(auVar230,ZEXT416((uint)(fVar329 * fVar150)),0x1c);
              auVar124 = vmovsldup_avx(ZEXT416((uint)(auVar101._0_4_ * fVar329 * fVar150 -
                                                     auVar124._0_4_ * fVar325)));
              auVar123 = vdivps_avx(auVar123,auVar124);
              auVar101 = vinsertps_avx(auVar101,auVar208,0x10);
              auVar101 = vdivps_avx(auVar101,auVar124);
              auVar124 = vmovsldup_avx(auVar182);
              auVar127 = ZEXT416((uint)(fVar160 - auVar18._0_4_));
              auVar18 = vmovsldup_avx(auVar127);
              auVar163._0_4_ = auVar124._0_4_ * auVar123._0_4_ + auVar18._0_4_ * auVar101._0_4_;
              auVar163._4_4_ = auVar124._4_4_ * auVar123._4_4_ + auVar18._4_4_ * auVar101._4_4_;
              auVar163._8_4_ = auVar124._8_4_ * auVar123._8_4_ + auVar18._8_4_ * auVar101._8_4_;
              auVar163._12_4_ = auVar124._12_4_ * auVar123._12_4_ + auVar18._12_4_ * auVar101._12_4_
              ;
              auVar185 = vsubps_avx(auVar185,auVar163);
              auVar164._8_4_ = 0x7fffffff;
              auVar164._0_8_ = 0x7fffffff7fffffff;
              auVar164._12_4_ = 0x7fffffff;
              auVar182 = vandps_avx(auVar182,auVar164);
              if (auVar182._0_4_ < fVar143) {
                auVar184._8_4_ = 0x7fffffff;
                auVar184._0_8_ = 0x7fffffff7fffffff;
                auVar184._12_4_ = 0x7fffffff;
                auVar182 = vandps_avx(auVar127,auVar184);
                if (auVar182._0_4_ < (float)local_720._0_4_ * 1.9073486e-06 + fVar316 + fVar143) {
                  bVar92 = uVar88 < 5;
                  fVar316 = auVar185._0_4_ + (float)local_7c0._0_4_;
                  bVar81 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar316) &&
                     (fVar143 = ray->tfar, fVar316 <= fVar143)) {
                    auVar185 = vmovshdup_avx(auVar185);
                    fVar325 = auVar185._0_4_;
                    bVar81 = 0;
                    if ((0.0 <= fVar325) && (bVar81 = 0, fVar325 <= 1.0)) {
                      auVar185 = vrsqrtss_avx(auVar206,auVar206);
                      fVar150 = auVar185._0_4_;
                      pGVar12 = (context->scene->geometries).items[uVar89].ptr;
                      if ((pGVar12->mask & ray->mask) == 0) {
                        bVar81 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar81 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar185 = ZEXT416((uint)(fVar150 * 1.5 +
                                                 fVar155 * -0.5 * fVar150 * fVar150 * fVar150));
                        auVar185 = vshufps_avx(auVar185,auVar185,0);
                        auVar186._0_4_ = auVar185._0_4_ * (float)local_9c0._0_4_;
                        auVar186._4_4_ = auVar185._4_4_ * (float)local_9c0._4_4_;
                        auVar186._8_4_ = auVar185._8_4_ * fStack_9b8;
                        auVar186._12_4_ = auVar185._12_4_ * fStack_9b4;
                        auVar103._0_4_ = auVar340._0_4_ + auVar19._0_4_ * auVar186._0_4_;
                        auVar103._4_4_ = auVar340._4_4_ + auVar19._4_4_ * auVar186._4_4_;
                        auVar103._8_4_ = auVar340._8_4_ + auVar19._8_4_ * auVar186._8_4_;
                        auVar103._12_4_ = auVar340._12_4_ + auVar19._12_4_ * auVar186._12_4_;
                        auVar185 = vshufps_avx(auVar186,auVar186,0xc9);
                        auVar206 = vshufps_avx(auVar340,auVar340,0xc9);
                        auVar187._0_4_ = auVar206._0_4_ * auVar186._0_4_;
                        auVar187._4_4_ = auVar206._4_4_ * auVar186._4_4_;
                        auVar187._8_4_ = auVar206._8_4_ * auVar186._8_4_;
                        auVar187._12_4_ = auVar206._12_4_ * auVar186._12_4_;
                        auVar209._0_4_ = auVar340._0_4_ * auVar185._0_4_;
                        auVar209._4_4_ = auVar340._4_4_ * auVar185._4_4_;
                        auVar209._8_4_ = auVar340._8_4_ * auVar185._8_4_;
                        auVar209._12_4_ = auVar340._12_4_ * auVar185._12_4_;
                        auVar182 = vsubps_avx(auVar209,auVar187);
                        auVar185 = vshufps_avx(auVar182,auVar182,0xc9);
                        auVar206 = vshufps_avx(auVar103,auVar103,0xc9);
                        auVar210._0_4_ = auVar206._0_4_ * auVar185._0_4_;
                        auVar210._4_4_ = auVar206._4_4_ * auVar185._4_4_;
                        auVar210._8_4_ = auVar206._8_4_ * auVar185._8_4_;
                        auVar210._12_4_ = auVar206._12_4_ * auVar185._12_4_;
                        auVar185 = vshufps_avx(auVar182,auVar182,0xd2);
                        auVar104._0_4_ = auVar103._0_4_ * auVar185._0_4_;
                        auVar104._4_4_ = auVar103._4_4_ * auVar185._4_4_;
                        auVar104._8_4_ = auVar103._8_4_ * auVar185._8_4_;
                        auVar104._12_4_ = auVar103._12_4_ * auVar185._12_4_;
                        auVar206 = vsubps_avx(auVar210,auVar104);
                        auVar185 = vshufps_avx(auVar206,auVar206,0xe9);
                        local_8e0 = vmovlps_avx(auVar185);
                        local_8d8 = auVar206._0_4_;
                        local_8d0 = 0;
                        local_8cc = (undefined4)local_8a8;
                        local_8c4 = context->user->instID[0];
                        local_8c0 = context->user->instPrimID[0];
                        ray->tfar = fVar316;
                        local_6c0._0_4_ = 0xffffffff;
                        local_970.valid = (int *)local_6c0;
                        local_970.geometryUserPtr = pGVar12->userPtr;
                        local_970.context = context->user;
                        local_970.hit = (RTCHitN *)&local_8e0;
                        local_970.N = 1;
                        local_970.ray = (RTCRayN *)ray;
                        local_8d4 = fVar325;
                        local_8c8 = uVar89;
                        if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00926085:
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            (*p_Var15)(&local_970);
                            if (*local_970.valid == 0) goto LAB_009260cd;
                          }
                          bVar81 = 1;
                        }
                        else {
                          auVar288 = ZEXT1664(auVar288._0_16_);
                          (*pGVar12->occlusionFilterN)(&local_970);
                          if (*local_970.valid != 0) goto LAB_00926085;
LAB_009260cd:
                          ray->tfar = fVar143;
                          bVar81 = 0;
                        }
                      }
                    }
                  }
                  goto LAB_00925e85;
                }
              }
            }
            bVar92 = false;
LAB_00925e85:
            fVar316 = ray->tfar;
            auVar116._4_4_ = fVar316;
            auVar116._0_4_ = fVar316;
            auVar116._8_4_ = fVar316;
            auVar116._12_4_ = fVar316;
            auVar116._16_4_ = fVar316;
            auVar116._20_4_ = fVar316;
            auVar116._24_4_ = fVar316;
            auVar116._28_4_ = fVar316;
            bVar91 = bVar91 | bVar92 & bVar81;
            auVar110 = vcmpps_avx(_local_760,auVar116,2);
            auVar110 = vandps_avx(auVar110,local_3a0);
            auVar324 = ZEXT3264(_local_740);
          }
          auVar138._0_4_ = auVar324._0_4_ + (float)local_6e0._0_4_;
          auVar138._4_4_ = auVar324._4_4_ + (float)local_6e0._4_4_;
          auVar138._8_4_ = auVar324._8_4_ + fStack_6d8;
          auVar138._12_4_ = auVar324._12_4_ + fStack_6d4;
          auVar138._16_4_ = auVar324._16_4_ + fStack_6d0;
          auVar138._20_4_ = auVar324._20_4_ + fStack_6cc;
          auVar138._24_4_ = auVar324._24_4_ + fStack_6c8;
          auVar138._28_4_ = auVar324._28_4_ + fStack_6c4;
          auVar105._0_4_ = ray->tfar;
          auVar105._4_4_ = ray->mask;
          auVar105._8_4_ = ray->id;
          auVar105._12_4_ = ray->flags;
          fVar316 = ray->tfar;
          auVar171._4_4_ = fVar316;
          auVar171._0_4_ = fVar316;
          auVar171._8_4_ = fVar316;
          auVar171._12_4_ = fVar316;
          auVar171._16_4_ = fVar316;
          auVar171._20_4_ = fVar316;
          auVar171._24_4_ = fVar316;
          auVar171._28_4_ = fVar316;
          auVar110 = vcmpps_avx(auVar138,auVar171,2);
          _local_760 = vandps_avx(auVar110,local_780);
          auVar139._8_4_ = 3;
          auVar139._0_8_ = 0x300000003;
          auVar139._12_4_ = 3;
          auVar139._16_4_ = 3;
          auVar139._20_4_ = 3;
          auVar139._24_4_ = 3;
          auVar139._28_4_ = 3;
          auVar172._8_4_ = 2;
          auVar172._0_8_ = 0x200000002;
          auVar172._12_4_ = 2;
          auVar172._16_4_ = 2;
          auVar172._20_4_ = 2;
          auVar172._24_4_ = 2;
          auVar172._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar172,auVar139,local_660);
          auVar185 = vpcmpgtd_avx(auVar110._16_16_,local_6a0);
          auVar206 = vpshufd_avx(local_680._0_16_,0);
          auVar206 = vpcmpgtd_avx(auVar110._0_16_,auVar206);
          auVar173._16_16_ = auVar185;
          auVar173._0_16_ = auVar105;
          local_780 = vblendps_avx(ZEXT1632(auVar206),auVar173,0xf0);
          local_6c0 = vandnps_avx(local_780,_local_760);
          local_7a0 = _local_580;
          local_740._4_4_ = (float)local_6e0._4_4_ + (float)local_580._4_4_;
          local_740._0_4_ = (float)local_6e0._0_4_ + (float)local_580._0_4_;
          fStack_738 = fStack_6d8 + fStack_578;
          fStack_734 = fStack_6d4 + fStack_574;
          fStack_730 = fStack_6d0 + fStack_570;
          fStack_72c = fStack_6cc + fStack_56c;
          fStack_728 = fStack_6c8 + fStack_568;
          fStack_724 = fStack_6c4 + fStack_564;
          auVar372 = ZEXT3264(_local_8a0);
          auVar342 = ZEXT3264(_local_920);
          auVar355 = ZEXT3264(_local_940);
          for (; (((((((local_6c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_6c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_6c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_6c0 >> 0x7f,0) != '\0') ||
                   (local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_6c0 >> 0xbf,0) != '\0') ||
                 (local_6c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_6c0[0x1f] < '\0'; local_6c0 = vandps_avx(auVar110,local_6c0)) {
            auVar117._8_4_ = 0x7f800000;
            auVar117._0_8_ = 0x7f8000007f800000;
            auVar117._12_4_ = 0x7f800000;
            auVar117._16_4_ = 0x7f800000;
            auVar117._20_4_ = 0x7f800000;
            auVar117._24_4_ = 0x7f800000;
            auVar117._28_4_ = 0x7f800000;
            auVar110 = vblendvps_avx(auVar117,local_7a0,local_6c0);
            auVar216 = vshufps_avx(auVar110,auVar110,0xb1);
            auVar216 = vminps_avx(auVar110,auVar216);
            auVar134 = vshufpd_avx(auVar216,auVar216,5);
            auVar216 = vminps_avx(auVar216,auVar134);
            auVar134 = vperm2f128_avx(auVar216,auVar216,1);
            auVar216 = vminps_avx(auVar216,auVar134);
            auVar216 = vcmpps_avx(auVar110,auVar216,0);
            auVar134 = local_6c0 & auVar216;
            auVar110 = local_6c0;
            if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0x7f,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0xbf,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar134[0x1f] < '\0') {
              auVar110 = vandps_avx(auVar216,local_6c0);
            }
            uVar82 = vmovmskps_avx(auVar110);
            uVar90 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar90 & 1) == 0; uVar90 = uVar90 + 1) {
              }
            }
            uVar84 = (ulong)uVar90;
            *(undefined4 *)(local_6c0 + uVar84 * 4) = 0;
            aVar8 = (ray->dir).field_0.field_1;
            local_7e0 = aVar8.x;
            fStack_7dc = aVar8.y;
            fStack_7d8 = aVar8.z;
            aStack_7d4 = aVar8.field_3;
            auVar185 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
            fVar316 = local_1c0[uVar84];
            uVar90 = *(uint *)(local_560 + uVar84 * 4);
            if (auVar185._0_4_ < 0.0) {
              auVar288 = ZEXT1664(auVar288._0_16_);
              auVar324 = ZEXT1664(auVar324._0_16_);
              fVar143 = sqrtf(auVar185._0_4_);
              auVar355 = ZEXT3264(_local_940);
              auVar342 = ZEXT3264(_local_920);
              auVar372 = ZEXT3264(_local_8a0);
              uVar84 = extraout_RAX_03;
            }
            else {
              auVar185 = vsqrtss_avx(auVar185,auVar185);
              fVar143 = auVar185._0_4_;
            }
            auVar206 = vminps_avx(auVar16,_local_990);
            auVar185 = vmaxps_avx(auVar16,_local_990);
            auVar182 = vminps_avx(_local_980,_local_9a0);
            auVar101 = vminps_avx(auVar206,auVar182);
            auVar206 = vmaxps_avx(_local_980,_local_9a0);
            auVar182 = vmaxps_avx(auVar185,auVar206);
            auVar188._8_4_ = 0x7fffffff;
            auVar188._0_8_ = 0x7fffffff7fffffff;
            auVar188._12_4_ = 0x7fffffff;
            auVar185 = vandps_avx(auVar101,auVar188);
            auVar206 = vandps_avx(auVar182,auVar188);
            auVar185 = vmaxps_avx(auVar185,auVar206);
            auVar206 = vmovshdup_avx(auVar185);
            auVar206 = vmaxss_avx(auVar206,auVar185);
            auVar185 = vshufpd_avx(auVar185,auVar185,1);
            auVar185 = vmaxss_avx(auVar185,auVar206);
            local_a20._0_4_ = auVar185._0_4_ * 1.9073486e-06;
            local_820._0_4_ = fVar143 * 1.9073486e-06;
            local_720._0_16_ = vshufps_avx(auVar182,auVar182,0xff);
            auVar185 = vinsertps_avx(ZEXT416(uVar90),ZEXT416((uint)fVar316),0x10);
            uVar88 = 0;
            while( true ) {
              bVar81 = (byte)uVar84;
              if (uVar88 == 5) break;
              auVar206 = vshufps_avx(auVar185,auVar185,0);
              auVar106._0_4_ = auVar206._0_4_ * local_7e0 + 0.0;
              auVar106._4_4_ = auVar206._4_4_ * fStack_7dc + 0.0;
              auVar106._8_4_ = auVar206._8_4_ * fStack_7d8 + 0.0;
              auVar106._12_4_ = auVar206._12_4_ * aStack_7d4.w + 0.0;
              auVar206 = vmovshdup_avx(auVar185);
              fVar329 = auVar206._0_4_;
              local_9e0._0_4_ = 1.0 - fVar329;
              fVar143 = fVar329 * fVar329;
              fVar325 = fVar329 * 3.0;
              fVar316 = fVar325 + -5.0;
              fVar150 = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
              auVar206 = ZEXT416((uint)(fVar329 * fVar329 * -(float)local_9e0._0_4_ * 0.5));
              auVar206 = vshufps_avx(auVar206,auVar206,0);
              auVar182 = ZEXT416((uint)((fVar150 * ((float)local_9e0._0_4_ * 3.0 + -5.0) + 2.0) *
                                       0.5));
              auVar182 = vshufps_avx(auVar182,auVar182,0);
              auVar101 = ZEXT416((uint)((fVar143 * fVar316 + 2.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar123 = ZEXT416((uint)((float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -fVar329 *
                                       0.5));
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              auVar165._0_4_ =
                   auVar123._0_4_ * local_af0 +
                   auVar101._0_4_ * (float)local_990._0_4_ +
                   auVar182._0_4_ * (float)local_980._0_4_ + auVar206._0_4_ * (float)local_9a0._0_4_
              ;
              auVar165._4_4_ =
                   auVar123._4_4_ * fStack_aec +
                   auVar101._4_4_ * (float)local_990._4_4_ +
                   auVar182._4_4_ * (float)local_980._4_4_ + auVar206._4_4_ * (float)local_9a0._4_4_
              ;
              auVar165._8_4_ =
                   auVar123._8_4_ * fStack_ae8 +
                   auVar101._8_4_ * fStack_988 +
                   auVar182._8_4_ * fStack_978 + auVar206._8_4_ * fStack_998;
              auVar165._12_4_ =
                   auVar123._12_4_ * fStack_ae4 +
                   auVar101._12_4_ * fStack_984 +
                   auVar182._12_4_ * fStack_974 + auVar206._12_4_ * fStack_994;
              fVar327 = (float)local_9e0._0_4_ * -2.0;
              local_800._0_16_ = auVar165;
              auVar206 = vsubps_avx(auVar106,auVar165);
              _local_9c0 = auVar206;
              auVar206 = vdpps_avx(auVar206,auVar206,0x7f);
              local_a40._0_16_ = ZEXT416((uint)(fVar325 + -1.0));
              fVar155 = auVar206._0_4_;
              if (fVar155 < 0.0) {
                local_900._0_4_ = fVar143;
                local_9e0._0_16_ = ZEXT416((uint)local_9e0._0_4_);
                local_a00._0_4_ = fVar325;
                local_840._0_4_ = fVar329 * 9.0;
                local_860._0_4_ = fVar316;
                local_880._0_4_ = fVar150;
                local_700._0_4_ = fVar327;
                fVar160 = sqrtf(fVar155);
                uVar84 = extraout_RAX_04;
                fVar316 = (float)local_860._0_4_;
                fVar270 = (float)local_840._0_4_;
                fVar327 = (float)local_700._0_4_;
                fVar143 = (float)local_900._0_4_;
                fVar325 = (float)local_a00._0_4_;
                fVar150 = (float)local_880._0_4_;
              }
              else {
                auVar182 = vsqrtss_avx(auVar206,auVar206);
                fVar160 = auVar182._0_4_;
                fVar270 = fVar329 * 9.0;
              }
              auVar182 = ZEXT416((uint)((fVar143 + fVar329 * fVar327) * 0.5));
              auVar182 = vshufps_avx(auVar182,auVar182,0);
              auVar101 = ZEXT416((uint)((((float)local_9e0._0_4_ + (float)local_9e0._0_4_) *
                                         (fVar325 + 2.0) +
                                        (float)local_9e0._0_4_ * (float)local_9e0._0_4_ * -3.0) *
                                       0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar123 = ZEXT416((uint)((fVar316 * (fVar329 + fVar329) + fVar329 * fVar325) * 0.5));
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              auVar124 = ZEXT416((uint)((fVar329 * ((float)local_9e0._0_4_ + (float)local_9e0._0_4_)
                                        - fVar150) * 0.5));
              auVar124 = vshufps_avx(auVar124,auVar124,0);
              auVar320._0_4_ =
                   local_af0 * auVar124._0_4_ +
                   (float)local_990._0_4_ * auVar123._0_4_ +
                   (float)local_9a0._0_4_ * auVar182._0_4_ + (float)local_980._0_4_ * auVar101._0_4_
              ;
              auVar320._4_4_ =
                   fStack_aec * auVar124._4_4_ +
                   (float)local_990._4_4_ * auVar123._4_4_ +
                   (float)local_9a0._4_4_ * auVar182._4_4_ + (float)local_980._4_4_ * auVar101._4_4_
              ;
              auVar320._8_4_ =
                   fStack_ae8 * auVar124._8_4_ +
                   fStack_988 * auVar123._8_4_ +
                   fStack_998 * auVar182._8_4_ + fStack_978 * auVar101._8_4_;
              auVar320._12_4_ =
                   fStack_ae4 * auVar124._12_4_ +
                   fStack_984 * auVar123._12_4_ +
                   fStack_994 * auVar182._12_4_ + fStack_974 * auVar101._12_4_;
              auVar324 = ZEXT1664(auVar320);
              auVar124 = vpermilps_avx(local_a40._0_16_,0);
              auVar18 = vpermilps_avx(ZEXT416((uint)(fVar329 * -9.0 + 4.0)),0);
              auVar182 = vshufps_avx(ZEXT416((uint)(fVar270 + -5.0)),ZEXT416((uint)(fVar270 + -5.0))
                                     ,0);
              auVar101 = ZEXT416((uint)(fVar329 * -3.0 + 2.0));
              auVar123 = vshufps_avx(auVar101,auVar101,0);
              auVar101 = vdpps_avx(auVar320,auVar320,0x7f);
              auVar128._0_4_ =
                   local_af0 * auVar123._0_4_ +
                   (float)local_990._0_4_ * auVar182._0_4_ +
                   (float)local_980._0_4_ * auVar18._0_4_ + (float)local_9a0._0_4_ * auVar124._0_4_;
              auVar128._4_4_ =
                   fStack_aec * auVar123._4_4_ +
                   (float)local_990._4_4_ * auVar182._4_4_ +
                   (float)local_980._4_4_ * auVar18._4_4_ + (float)local_9a0._4_4_ * auVar124._4_4_;
              auVar128._8_4_ =
                   fStack_ae8 * auVar123._8_4_ +
                   fStack_988 * auVar182._8_4_ +
                   fStack_978 * auVar18._8_4_ + fStack_998 * auVar124._8_4_;
              auVar128._12_4_ =
                   fStack_ae4 * auVar123._12_4_ +
                   fStack_984 * auVar182._12_4_ +
                   fStack_974 * auVar18._12_4_ + fStack_994 * auVar124._12_4_;
              auVar182 = vblendps_avx(auVar101,_DAT_01f45a50,0xe);
              auVar123 = vrsqrtss_avx(auVar182,auVar182);
              fVar143 = auVar123._0_4_;
              fVar316 = auVar101._0_4_;
              auVar123 = vdpps_avx(auVar320,auVar128,0x7f);
              auVar124 = vshufps_avx(auVar101,auVar101,0);
              auVar129._0_4_ = auVar128._0_4_ * auVar124._0_4_;
              auVar129._4_4_ = auVar128._4_4_ * auVar124._4_4_;
              auVar129._8_4_ = auVar128._8_4_ * auVar124._8_4_;
              auVar129._12_4_ = auVar128._12_4_ * auVar124._12_4_;
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              auVar211._0_4_ = auVar320._0_4_ * auVar123._0_4_;
              auVar211._4_4_ = auVar320._4_4_ * auVar123._4_4_;
              auVar211._8_4_ = auVar320._8_4_ * auVar123._8_4_;
              auVar211._12_4_ = auVar320._12_4_ * auVar123._12_4_;
              auVar18 = vsubps_avx(auVar129,auVar211);
              auVar123 = vrcpss_avx(auVar182,auVar182);
              auVar182 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                    ZEXT416((uint)(auVar185._0_4_ * (float)local_820._0_4_)));
              auVar123 = ZEXT416((uint)(auVar123._0_4_ * (2.0 - fVar316 * auVar123._0_4_)));
              auVar123 = vshufps_avx(auVar123,auVar123,0);
              uVar72 = CONCAT44(auVar320._4_4_,auVar320._0_4_);
              auVar282._0_8_ = uVar72 ^ 0x8000000080000000;
              auVar282._8_4_ = -auVar320._8_4_;
              auVar282._12_4_ = -auVar320._12_4_;
              auVar124 = ZEXT416((uint)(fVar143 * 1.5 + fVar316 * -0.5 * fVar143 * fVar143 * fVar143
                                       ));
              auVar124 = vshufps_avx(auVar124,auVar124,0);
              auVar189._0_4_ = auVar124._0_4_ * auVar18._0_4_ * auVar123._0_4_;
              auVar189._4_4_ = auVar124._4_4_ * auVar18._4_4_ * auVar123._4_4_;
              auVar189._8_4_ = auVar124._8_4_ * auVar18._8_4_ * auVar123._8_4_;
              auVar189._12_4_ = auVar124._12_4_ * auVar18._12_4_ * auVar123._12_4_;
              local_9e0._0_4_ = auVar320._0_4_ * auVar124._0_4_;
              local_9e0._4_4_ = auVar320._4_4_ * auVar124._4_4_;
              local_9e0._8_4_ = auVar320._8_4_ * auVar124._8_4_;
              local_9e0._12_4_ = auVar320._12_4_ * auVar124._12_4_;
              local_a40._0_4_ = auVar182._0_4_;
              if (fVar316 < 0.0) {
                local_900._0_16_ = auVar282;
                local_a00._0_16_ = auVar189;
                auVar324 = ZEXT1664(auVar320);
                fVar143 = sqrtf(fVar316);
                uVar84 = extraout_RAX_05;
                auVar189 = local_a00._0_16_;
                auVar282 = local_900._0_16_;
                fVar316 = (float)local_a40._0_4_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar143 = auVar101._0_4_;
                fVar316 = auVar182._0_4_;
              }
              auVar288 = ZEXT1664(auVar282);
              auVar182 = vdpps_avx(_local_9c0,local_9e0._0_16_,0x7f);
              local_900._0_4_ =
                   ((float)local_a20._0_4_ / fVar143) * (fVar160 + 1.0) +
                   fVar160 * (float)local_a20._0_4_ + fVar316;
              auVar101 = vdpps_avx(auVar282,local_9e0._0_16_,0x7f);
              auVar123 = vdpps_avx(_local_9c0,auVar189,0x7f);
              auVar77._4_4_ = fStack_7dc;
              auVar77._0_4_ = local_7e0;
              auVar77._8_4_ = fStack_7d8;
              auVar77._12_4_ = aStack_7d4.a;
              auVar124 = vdpps_avx(auVar77,local_9e0._0_16_,0x7f);
              auVar18 = vdpps_avx(_local_9c0,auVar282,0x7f);
              fVar316 = auVar101._0_4_ + auVar123._0_4_;
              fVar143 = auVar182._0_4_;
              auVar107._0_4_ = fVar143 * fVar143;
              auVar107._4_4_ = auVar182._4_4_ * auVar182._4_4_;
              auVar107._8_4_ = auVar182._8_4_ * auVar182._8_4_;
              auVar107._12_4_ = auVar182._12_4_ * auVar182._12_4_;
              auVar123 = vsubps_avx(auVar206,auVar107);
              local_9e0._0_16_ = ZEXT416((uint)fVar316);
              auVar101 = vdpps_avx(_local_9c0,auVar77,0x7f);
              fVar325 = auVar18._0_4_ - fVar143 * fVar316;
              fVar143 = auVar101._0_4_ - fVar143 * auVar124._0_4_;
              auVar101 = vrsqrtss_avx(auVar123,auVar123);
              fVar150 = auVar123._0_4_;
              fVar316 = auVar101._0_4_;
              fVar316 = fVar316 * 1.5 + fVar150 * -0.5 * fVar316 * fVar316 * fVar316;
              if (fVar150 < 0.0) {
                local_a00._0_16_ = auVar124;
                local_840._0_4_ = fVar325;
                local_860._0_4_ = fVar143;
                local_880._0_4_ = fVar316;
                auVar288 = ZEXT1664(auVar282);
                auVar324 = ZEXT1664(auVar324._0_16_);
                fVar150 = sqrtf(fVar150);
                uVar84 = extraout_RAX_06;
                fVar316 = (float)local_880._0_4_;
                fVar325 = (float)local_840._0_4_;
                fVar143 = (float)local_860._0_4_;
                auVar124 = local_a00._0_16_;
              }
              else {
                auVar101 = vsqrtss_avx(auVar123,auVar123);
                fVar150 = auVar101._0_4_;
              }
              auVar372 = ZEXT3264(_local_8a0);
              auVar342 = ZEXT3264(_local_920);
              auVar355 = ZEXT3264(_local_940);
              auVar18 = vpermilps_avx(local_800._0_16_,0xff);
              auVar19 = vpermilps_avx(auVar320,0xff);
              fVar325 = fVar325 * fVar316 - auVar19._0_4_;
              auVar212._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
              auVar212._8_4_ = auVar124._8_4_ ^ 0x80000000;
              auVar212._12_4_ = auVar124._12_4_ ^ 0x80000000;
              auVar231._0_4_ = -fVar325;
              auVar231._4_4_ = 0x80000000;
              auVar231._8_4_ = 0x80000000;
              auVar231._12_4_ = 0x80000000;
              auVar101 = vinsertps_avx(auVar231,ZEXT416((uint)(fVar143 * fVar316)),0x1c);
              auVar124 = vmovsldup_avx(ZEXT416((uint)(local_9e0._0_4_ * fVar143 * fVar316 -
                                                     auVar124._0_4_ * fVar325)));
              auVar101 = vdivps_avx(auVar101,auVar124);
              auVar123 = vinsertps_avx(local_9e0._0_16_,auVar212,0x10);
              auVar123 = vdivps_avx(auVar123,auVar124);
              auVar124 = vmovsldup_avx(auVar182);
              auVar127 = ZEXT416((uint)(fVar150 - auVar18._0_4_));
              auVar18 = vmovsldup_avx(auVar127);
              auVar166._0_4_ = auVar124._0_4_ * auVar101._0_4_ + auVar18._0_4_ * auVar123._0_4_;
              auVar166._4_4_ = auVar124._4_4_ * auVar101._4_4_ + auVar18._4_4_ * auVar123._4_4_;
              auVar166._8_4_ = auVar124._8_4_ * auVar101._8_4_ + auVar18._8_4_ * auVar123._8_4_;
              auVar166._12_4_ = auVar124._12_4_ * auVar101._12_4_ + auVar18._12_4_ * auVar123._12_4_
              ;
              auVar185 = vsubps_avx(auVar185,auVar166);
              auVar167._8_4_ = 0x7fffffff;
              auVar167._0_8_ = 0x7fffffff7fffffff;
              auVar167._12_4_ = 0x7fffffff;
              auVar182 = vandps_avx(auVar182,auVar167);
              if (auVar182._0_4_ < (float)local_900._0_4_) {
                auVar190._8_4_ = 0x7fffffff;
                auVar190._0_8_ = 0x7fffffff7fffffff;
                auVar190._12_4_ = 0x7fffffff;
                auVar182 = vandps_avx(auVar127,auVar190);
                if (auVar182._0_4_ <
                    (float)local_720._0_4_ * 1.9073486e-06 +
                    (float)local_900._0_4_ + (float)local_a40._0_4_) {
                  bVar92 = uVar88 < 5;
                  fVar316 = auVar185._0_4_ + (float)local_7c0._0_4_;
                  bVar81 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar316) &&
                     (fVar143 = ray->tfar, fVar316 <= fVar143)) {
                    auVar185 = vmovshdup_avx(auVar185);
                    fVar325 = auVar185._0_4_;
                    bVar81 = 0;
                    if ((0.0 <= fVar325) && (bVar81 = 0, fVar325 <= 1.0)) {
                      auVar185 = vrsqrtss_avx(auVar206,auVar206);
                      fVar150 = auVar185._0_4_;
                      pGVar12 = (context->scene->geometries).items[uVar89].ptr;
                      if ((pGVar12->mask & ray->mask) == 0) {
                        bVar81 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar81 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar185 = ZEXT416((uint)(fVar150 * 1.5 +
                                                 fVar155 * -0.5 * fVar150 * fVar150 * fVar150));
                        auVar185 = vshufps_avx(auVar185,auVar185,0);
                        auVar191._0_4_ = auVar185._0_4_ * (float)local_9c0._0_4_;
                        auVar191._4_4_ = auVar185._4_4_ * (float)local_9c0._4_4_;
                        auVar191._8_4_ = auVar185._8_4_ * fStack_9b8;
                        auVar191._12_4_ = auVar185._12_4_ * fStack_9b4;
                        auVar108._0_4_ = auVar320._0_4_ + auVar19._0_4_ * auVar191._0_4_;
                        auVar108._4_4_ = auVar320._4_4_ + auVar19._4_4_ * auVar191._4_4_;
                        auVar108._8_4_ = auVar320._8_4_ + auVar19._8_4_ * auVar191._8_4_;
                        auVar108._12_4_ = auVar320._12_4_ + auVar19._12_4_ * auVar191._12_4_;
                        auVar185 = vshufps_avx(auVar191,auVar191,0xc9);
                        auVar206 = vshufps_avx(auVar320,auVar320,0xc9);
                        auVar192._0_4_ = auVar206._0_4_ * auVar191._0_4_;
                        auVar192._4_4_ = auVar206._4_4_ * auVar191._4_4_;
                        auVar192._8_4_ = auVar206._8_4_ * auVar191._8_4_;
                        auVar192._12_4_ = auVar206._12_4_ * auVar191._12_4_;
                        auVar213._0_4_ = auVar320._0_4_ * auVar185._0_4_;
                        auVar213._4_4_ = auVar320._4_4_ * auVar185._4_4_;
                        auVar213._8_4_ = auVar320._8_4_ * auVar185._8_4_;
                        auVar213._12_4_ = auVar320._12_4_ * auVar185._12_4_;
                        auVar182 = vsubps_avx(auVar213,auVar192);
                        auVar185 = vshufps_avx(auVar182,auVar182,0xc9);
                        auVar206 = vshufps_avx(auVar108,auVar108,0xc9);
                        auVar214._0_4_ = auVar206._0_4_ * auVar185._0_4_;
                        auVar214._4_4_ = auVar206._4_4_ * auVar185._4_4_;
                        auVar214._8_4_ = auVar206._8_4_ * auVar185._8_4_;
                        auVar214._12_4_ = auVar206._12_4_ * auVar185._12_4_;
                        auVar185 = vshufps_avx(auVar182,auVar182,0xd2);
                        auVar109._0_4_ = auVar108._0_4_ * auVar185._0_4_;
                        auVar109._4_4_ = auVar108._4_4_ * auVar185._4_4_;
                        auVar109._8_4_ = auVar108._8_4_ * auVar185._8_4_;
                        auVar109._12_4_ = auVar108._12_4_ * auVar185._12_4_;
                        auVar206 = vsubps_avx(auVar214,auVar109);
                        auVar185 = vshufps_avx(auVar206,auVar206,0xe9);
                        local_8e0 = vmovlps_avx(auVar185);
                        local_8d8 = auVar206._0_4_;
                        local_8d0 = 0;
                        local_8cc = (undefined4)local_8a8;
                        local_8c4 = context->user->instID[0];
                        local_8c0 = context->user->instPrimID[0];
                        ray->tfar = fVar316;
                        local_a44 = -1;
                        local_970.valid = &local_a44;
                        local_970.geometryUserPtr = pGVar12->userPtr;
                        local_970.context = context->user;
                        local_970.hit = (RTCHitN *)&local_8e0;
                        local_970.N = 1;
                        local_970.ray = (RTCRayN *)ray;
                        local_8d4 = fVar325;
                        local_8c8 = uVar89;
                        if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00926b76:
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            auVar324 = ZEXT1664(auVar324._0_16_);
                            (*p_Var15)(&local_970);
                            if (*local_970.valid == 0) goto LAB_00926bbe;
                          }
                          bVar81 = 1;
                        }
                        else {
                          auVar288 = ZEXT1664(auVar288._0_16_);
                          auVar324 = ZEXT1664(auVar324._0_16_);
                          (*pGVar12->occlusionFilterN)(&local_970);
                          if (*local_970.valid != 0) goto LAB_00926b76;
LAB_00926bbe:
                          ray->tfar = fVar143;
                          bVar81 = 0;
                        }
                        auVar372 = ZEXT3264(_local_8a0);
                        auVar342 = ZEXT3264(_local_920);
                        auVar355 = ZEXT3264(_local_940);
                      }
                    }
                  }
                  goto LAB_00926974;
                }
              }
              uVar88 = uVar88 + 1;
            }
            bVar92 = false;
LAB_00926974:
            bVar91 = bVar91 | bVar92 & bVar81;
            fVar316 = ray->tfar;
            auVar140._4_4_ = fVar316;
            auVar140._0_4_ = fVar316;
            auVar140._8_4_ = fVar316;
            auVar140._12_4_ = fVar316;
            auVar140._16_4_ = fVar316;
            auVar140._20_4_ = fVar316;
            auVar140._24_4_ = fVar316;
            auVar140._28_4_ = fVar316;
            auVar105._0_4_ = ray->tfar;
            auVar105._4_4_ = ray->mask;
            auVar105._8_4_ = ray->id;
            auVar105._12_4_ = ray->flags;
            auVar110 = vcmpps_avx(_local_740,auVar140,2);
          }
          auVar110 = vandps_avx(local_640,local_620);
          auVar216 = vandps_avx(local_780,_local_760);
          auVar220._0_4_ = (float)local_6e0._0_4_ + local_540._0_4_;
          auVar220._4_4_ = (float)local_6e0._4_4_ + local_540._4_4_;
          auVar220._8_4_ = fStack_6d8 + local_540._8_4_;
          auVar220._12_4_ = fStack_6d4 + local_540._12_4_;
          auVar220._16_4_ = fStack_6d0 + local_540._16_4_;
          auVar220._20_4_ = fStack_6cc + local_540._20_4_;
          auVar220._24_4_ = fStack_6c8 + local_540._24_4_;
          auVar220._28_4_ = fStack_6c4 + local_540._28_4_;
          auVar185 = vshufps_avx(auVar105,auVar105,0);
          auVar239._16_16_ = auVar185;
          auVar239._0_16_ = auVar185;
          auVar134 = vcmpps_avx(auVar220,auVar239,2);
          auVar110 = vandps_avx(auVar134,auVar110);
          auVar221._0_4_ = (float)local_6e0._0_4_ + local_580._0_4_;
          auVar221._4_4_ = (float)local_6e0._4_4_ + local_580._4_4_;
          auVar221._8_4_ = fStack_6d8 + local_580._8_4_;
          auVar221._12_4_ = fStack_6d4 + local_580._12_4_;
          auVar221._16_4_ = fStack_6d0 + local_580._16_4_;
          auVar221._20_4_ = fStack_6cc + local_580._20_4_;
          auVar221._24_4_ = fStack_6c8 + local_580._24_4_;
          auVar221._28_4_ = fStack_6c4 + local_580._28_4_;
          auVar134 = vcmpps_avx(auVar221,auVar239,2);
          auVar216 = vandps_avx(auVar134,auVar216);
          auVar216 = vorps_avx(auVar110,auVar216);
          if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar216 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar216 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar216 >> 0x7f,0) != '\0') ||
                (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar216 >> 0xbf,0) != '\0') ||
              (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar216[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x60) = auVar216;
            auVar110 = vblendvps_avx(_local_580,local_540,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar110;
            uVar84 = vmovlps_avx(local_590);
            (&uStack_140)[uVar83 * 0xc] = uVar84;
            auStack_138[uVar83 * 0x18] = local_b24 + 1;
            uVar83 = (ulong)((int)uVar83 + 1);
          }
          auVar201 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          goto LAB_009254db;
        }
      }
      auVar201 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar372 = ZEXT3264(_local_8a0);
      auVar342 = ZEXT3264(_local_920);
      auVar355 = ZEXT3264(_local_940);
    }
LAB_009254db:
    auVar10._0_4_ = ray->tfar;
    auVar10._4_4_ = ray->mask;
    auVar10._8_4_ = ray->id;
    auVar10._12_4_ = ray->flags;
    fVar316 = ray->tfar;
    auVar168._4_4_ = fVar316;
    auVar168._0_4_ = fVar316;
    auVar168._8_4_ = fVar316;
    auVar168._12_4_ = fVar316;
    auVar168._16_4_ = fVar316;
    auVar168._20_4_ = fVar316;
    auVar168._24_4_ = fVar316;
    auVar168._28_4_ = fVar316;
    while( true ) {
      uVar90 = (uint)uVar83;
      if (uVar90 == 0) {
        if (bVar91 != 0) goto LAB_00926de8;
        auVar17 = vshufps_avx(auVar10,auVar10,0);
        auVar17 = vcmpps_avx(local_5a0,auVar17,2);
        uVar89 = vmovmskps_avx(auVar17);
        uVar89 = (uint)local_7a8 - 1 & (uint)local_7a8 & uVar89;
        goto LAB_0092432c;
      }
      uVar83 = (ulong)(uVar90 - 1);
      lVar86 = uVar83 * 0x60;
      auVar216 = *(undefined1 (*) [32])(auStack_180 + lVar86);
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar86);
      auVar133._0_4_ = auVar110._0_4_ + (float)local_6e0._0_4_;
      auVar133._4_4_ = auVar110._4_4_ + (float)local_6e0._4_4_;
      auVar133._8_4_ = auVar110._8_4_ + fStack_6d8;
      auVar133._12_4_ = auVar110._12_4_ + fStack_6d4;
      auVar133._16_4_ = auVar110._16_4_ + fStack_6d0;
      auVar133._20_4_ = auVar110._20_4_ + fStack_6cc;
      auVar133._24_4_ = auVar110._24_4_ + fStack_6c8;
      auVar133._28_4_ = auVar110._28_4_ + fStack_6c4;
      auVar197 = vcmpps_avx(auVar133,auVar168,2);
      auVar134 = vandps_avx(auVar197,auVar216);
      local_540 = auVar134;
      auVar197 = auVar216 & auVar197;
      if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar197 >> 0x7f,0) != '\0') ||
            (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar197 >> 0xbf,0) != '\0') ||
          (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar197[0x1f] < '\0') break;
      uVar83 = (ulong)(uVar90 - 1);
      auVar201 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
    }
    auVar113._8_4_ = 0x7f800000;
    auVar113._0_8_ = 0x7f8000007f800000;
    auVar113._12_4_ = 0x7f800000;
    auVar113._16_4_ = 0x7f800000;
    auVar113._20_4_ = 0x7f800000;
    auVar113._24_4_ = 0x7f800000;
    auVar113._28_4_ = 0x7f800000;
    auVar110 = vblendvps_avx(auVar113,auVar110,auVar134);
    auVar197 = vshufps_avx(auVar110,auVar110,0xb1);
    auVar197 = vminps_avx(auVar110,auVar197);
    auVar21 = vshufpd_avx(auVar197,auVar197,5);
    auVar197 = vminps_avx(auVar197,auVar21);
    auVar21 = vperm2f128_avx(auVar197,auVar197,1);
    auVar197 = vminps_avx(auVar197,auVar21);
    auVar110 = vcmpps_avx(auVar110,auVar197,0);
    auVar197 = auVar134 & auVar110;
    if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar197 >> 0x7f,0) != '\0') ||
          (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar197 >> 0xbf,0) != '\0') ||
        (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar197[0x1f] < '\0') {
      auVar134 = vandps_avx(auVar110,auVar134);
    }
    auVar99._8_8_ = 0;
    auVar99._0_8_ = (&uStack_140)[uVar83 * 0xc];
    local_b24 = auStack_138[uVar83 * 0x18];
    uVar85 = vmovmskps_avx(auVar134);
    uVar82 = 0;
    if (uVar85 != 0) {
      for (; (uVar85 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
      }
    }
    *(undefined4 *)(local_540 + (ulong)uVar82 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar86) = local_540;
    uVar85 = uVar90 - 1;
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      uVar85 = uVar90;
    }
    auVar185 = vshufps_avx(auVar99,auVar99,0);
    auVar206 = vshufps_avx(auVar99,auVar99,0x55);
    auVar206 = vsubps_avx(auVar206,auVar185);
    local_580._4_4_ = auVar185._4_4_ + auVar206._4_4_ * 0.14285715;
    local_580._0_4_ = auVar185._0_4_ + auVar206._0_4_ * 0.0;
    fStack_578 = auVar185._8_4_ + auVar206._8_4_ * 0.2857143;
    fStack_574 = auVar185._12_4_ + auVar206._12_4_ * 0.42857146;
    fStack_570 = auVar185._0_4_ + auVar206._0_4_ * 0.5714286;
    fStack_56c = auVar185._4_4_ + auVar206._4_4_ * 0.71428573;
    fStack_568 = auVar185._8_4_ + auVar206._8_4_ * 0.8571429;
    fStack_564 = auVar185._12_4_ + auVar206._12_4_;
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_580 + (ulong)uVar82 * 4);
    uVar83 = (ulong)uVar85;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }